

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  byte bVar66;
  long lVar67;
  Geometry *geometry;
  long lVar68;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar69;
  ulong uVar70;
  bool bVar71;
  undefined8 unaff_R12;
  long lVar72;
  ulong uVar73;
  byte bVar74;
  float fVar75;
  float fVar76;
  float fVar122;
  float fVar126;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar81 [16];
  float fVar123;
  float fVar129;
  float fVar130;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar133;
  undefined1 auVar134 [16];
  float fVar137;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined8 uVar138;
  undefined1 auVar139 [32];
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  RTCFilterFunctionNArguments args;
  int local_54c;
  long local_548;
  Primitive *local_540;
  Ray *local_538;
  ulong local_530;
  ulong local_528;
  Precalculations *local_520;
  float local_514;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  RayQueryContext *local_498;
  Geometry *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  ulong local_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_520 = pre;
  uVar73 = (ulong)(byte)prim[1];
  fVar157 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar140 = fVar157 * (ray->dir).field_0.m128[0];
  fVar145 = fVar157 * auVar21._0_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar80);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar79);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar134);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar73 * 0xc + 6);
  auVar93 = vpmovsxbd_avx2(auVar8);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar91 = vpmovsxbd_avx2(auVar9);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar100 = vpmovsxbd_avx2(auVar10);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar73 * 0x13 + 6);
  auVar86 = vpmovsxbd_avx2(auVar77);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vcvtdq2ps_avx(auVar86);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar73 * 0x14 + 6);
  auVar94 = vpmovsxbd_avx2(auVar11);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar168._4_4_ = fVar140;
  auVar168._0_4_ = fVar140;
  auVar168._8_4_ = fVar140;
  auVar168._12_4_ = fVar140;
  auVar168._16_4_ = fVar140;
  auVar168._20_4_ = fVar140;
  auVar168._24_4_ = fVar140;
  auVar168._28_4_ = fVar140;
  auVar82 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar87 = ZEXT1632(CONCAT412(fVar157 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar157 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar157 * (ray->dir).field_0.m128[1],fVar140))));
  auVar83 = vpermps_avx512vl(auVar82,auVar87);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar85 = vpermps_avx512vl(auVar84,auVar87);
  fVar140 = auVar85._0_4_;
  auVar172._0_4_ = fVar140 * auVar89._0_4_;
  fVar137 = auVar85._4_4_;
  auVar172._4_4_ = fVar137 * auVar89._4_4_;
  fVar75 = auVar85._8_4_;
  auVar172._8_4_ = fVar75 * auVar89._8_4_;
  fVar76 = auVar85._12_4_;
  auVar172._12_4_ = fVar76 * auVar89._12_4_;
  fVar122 = auVar85._16_4_;
  auVar172._16_4_ = fVar122 * auVar89._16_4_;
  fVar123 = auVar85._20_4_;
  auVar172._20_4_ = fVar123 * auVar89._20_4_;
  fVar126 = auVar85._24_4_;
  auVar172._28_36_ = in_ZMM4._28_36_;
  auVar172._24_4_ = fVar126 * auVar89._24_4_;
  auVar87._4_4_ = auVar91._4_4_ * fVar137;
  auVar87._0_4_ = auVar91._0_4_ * fVar140;
  auVar87._8_4_ = auVar91._8_4_ * fVar75;
  auVar87._12_4_ = auVar91._12_4_ * fVar76;
  auVar87._16_4_ = auVar91._16_4_ * fVar122;
  auVar87._20_4_ = auVar91._20_4_ * fVar123;
  auVar87._24_4_ = auVar91._24_4_ * fVar126;
  auVar87._28_4_ = auVar86._28_4_;
  auVar86._4_4_ = auVar94._4_4_ * fVar137;
  auVar86._0_4_ = auVar94._0_4_ * fVar140;
  auVar86._8_4_ = auVar94._8_4_ * fVar75;
  auVar86._12_4_ = auVar94._12_4_ * fVar76;
  auVar86._16_4_ = auVar94._16_4_ * fVar122;
  auVar86._20_4_ = auVar94._20_4_ * fVar123;
  auVar86._24_4_ = auVar94._24_4_ * fVar126;
  auVar86._28_4_ = auVar85._28_4_;
  auVar78 = vfmadd231ps_fma(auVar172._0_32_,auVar83,auVar88);
  auVar80 = vfmadd231ps_fma(auVar87,auVar83,auVar93);
  auVar79 = vfmadd231ps_fma(auVar86,auVar99,auVar83);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar168,auVar92);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar168,auVar90);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar100,auVar168);
  auVar169._4_4_ = fVar145;
  auVar169._0_4_ = fVar145;
  auVar169._8_4_ = fVar145;
  auVar169._12_4_ = fVar145;
  auVar169._16_4_ = fVar145;
  auVar169._20_4_ = fVar145;
  auVar169._24_4_ = fVar145;
  auVar169._28_4_ = fVar145;
  auVar87 = ZEXT1632(CONCAT412(fVar157 * auVar21._12_4_,
                               CONCAT48(fVar157 * auVar21._8_4_,
                                        CONCAT44(fVar157 * auVar21._4_4_,fVar145))));
  auVar86 = vpermps_avx512vl(auVar82,auVar87);
  auVar87 = vpermps_avx512vl(auVar84,auVar87);
  fVar157 = auVar87._0_4_;
  fVar140 = auVar87._4_4_;
  auVar82._4_4_ = fVar140 * auVar89._4_4_;
  auVar82._0_4_ = fVar157 * auVar89._0_4_;
  fVar137 = auVar87._8_4_;
  auVar82._8_4_ = fVar137 * auVar89._8_4_;
  fVar75 = auVar87._12_4_;
  auVar82._12_4_ = fVar75 * auVar89._12_4_;
  fVar76 = auVar87._16_4_;
  auVar82._16_4_ = fVar76 * auVar89._16_4_;
  fVar122 = auVar87._20_4_;
  auVar82._20_4_ = fVar122 * auVar89._20_4_;
  fVar123 = auVar87._24_4_;
  auVar82._24_4_ = fVar123 * auVar89._24_4_;
  auVar82._28_4_ = auVar89._28_4_;
  auVar96._0_4_ = auVar91._0_4_ * fVar157;
  auVar96._4_4_ = auVar91._4_4_ * fVar140;
  auVar96._8_4_ = auVar91._8_4_ * fVar137;
  auVar96._12_4_ = auVar91._12_4_ * fVar75;
  auVar96._16_4_ = auVar91._16_4_ * fVar76;
  auVar96._20_4_ = auVar91._20_4_ * fVar122;
  auVar96._24_4_ = auVar91._24_4_ * fVar123;
  auVar96._28_4_ = 0;
  auVar91._4_4_ = auVar94._4_4_ * fVar140;
  auVar91._0_4_ = auVar94._0_4_ * fVar157;
  auVar91._8_4_ = auVar94._8_4_ * fVar137;
  auVar91._12_4_ = auVar94._12_4_ * fVar75;
  auVar91._16_4_ = auVar94._16_4_ * fVar76;
  auVar91._20_4_ = auVar94._20_4_ * fVar122;
  auVar91._24_4_ = auVar94._24_4_ * fVar123;
  auVar91._28_4_ = auVar87._28_4_;
  auVar134 = vfmadd231ps_fma(auVar82,auVar86,auVar88);
  auVar8 = vfmadd231ps_fma(auVar96,auVar86,auVar93);
  auVar9 = vfmadd231ps_fma(auVar91,auVar86,auVar99);
  auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar169,auVar92);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar169,auVar90);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar169,auVar100);
  auVar162._8_4_ = 0x7fffffff;
  auVar162._0_8_ = 0x7fffffff7fffffff;
  auVar162._12_4_ = 0x7fffffff;
  auVar162._16_4_ = 0x7fffffff;
  auVar162._20_4_ = 0x7fffffff;
  auVar162._24_4_ = 0x7fffffff;
  auVar162._28_4_ = 0x7fffffff;
  auVar92 = vandps_avx(auVar162,ZEXT1632(auVar78));
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar92,auVar98,1);
  bVar71 = (bool)((byte)uVar69 & 1);
  auVar83._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._0_4_;
  bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._4_4_;
  bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._8_4_;
  bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar78._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(auVar162,ZEXT1632(auVar80));
  uVar69 = vcmpps_avx512vl(auVar92,auVar98,1);
  bVar71 = (bool)((byte)uVar69 & 1);
  auVar84._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar80._0_4_;
  bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar80._4_4_;
  bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar80._8_4_;
  bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar80._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(auVar162,ZEXT1632(auVar79));
  uVar69 = vcmpps_avx512vl(auVar92,auVar98,1);
  bVar71 = (bool)((byte)uVar69 & 1);
  auVar92._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar79._0_4_;
  bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar79._4_4_;
  bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar79._8_4_;
  bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar79._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar83);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar90 = vfnmadd213ps_avx512vl(auVar83,auVar88,auVar89);
  auVar78 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar84);
  auVar90 = vfnmadd213ps_avx512vl(auVar84,auVar88,auVar89);
  auVar80 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar92);
  auVar89 = vfnmadd213ps_avx512vl(auVar92,auVar88,auVar89);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar79 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar134));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar100._4_4_ = auVar78._4_4_ * auVar92._4_4_;
  auVar100._0_4_ = auVar78._0_4_ * auVar92._0_4_;
  auVar100._8_4_ = auVar78._8_4_ * auVar92._8_4_;
  auVar100._12_4_ = auVar78._12_4_ * auVar92._12_4_;
  auVar100._16_4_ = auVar92._16_4_ * 0.0;
  auVar100._20_4_ = auVar92._20_4_ * 0.0;
  auVar100._24_4_ = auVar92._24_4_ * 0.0;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar88);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar134));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0xe + 6));
  auVar97._0_4_ = auVar78._0_4_ * auVar92._0_4_;
  auVar97._4_4_ = auVar78._4_4_ * auVar92._4_4_;
  auVar97._8_4_ = auVar78._8_4_ * auVar92._8_4_;
  auVar97._12_4_ = auVar78._12_4_ * auVar92._12_4_;
  auVar97._16_4_ = auVar92._16_4_ * 0.0;
  auVar97._20_4_ = auVar92._20_4_ * 0.0;
  auVar97._24_4_ = auVar92._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar92 = vcvtdq2ps_avx(auVar88);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar99._4_4_ = auVar80._4_4_ * auVar92._4_4_;
  auVar99._0_4_ = auVar80._0_4_ * auVar92._0_4_;
  auVar99._8_4_ = auVar80._8_4_ * auVar92._8_4_;
  auVar99._12_4_ = auVar80._12_4_ * auVar92._12_4_;
  auVar99._16_4_ = auVar92._16_4_ * 0.0;
  auVar99._20_4_ = auVar92._20_4_ * 0.0;
  auVar99._24_4_ = auVar92._24_4_ * 0.0;
  auVar99._28_4_ = auVar92._28_4_;
  auVar91 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar95._0_4_ = auVar80._0_4_ * auVar92._0_4_;
  auVar95._4_4_ = auVar80._4_4_ * auVar92._4_4_;
  auVar95._8_4_ = auVar80._8_4_ * auVar92._8_4_;
  auVar95._12_4_ = auVar80._12_4_ * auVar92._12_4_;
  auVar95._16_4_ = auVar92._16_4_ * 0.0;
  auVar95._20_4_ = auVar92._20_4_ * 0.0;
  auVar95._24_4_ = auVar92._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x15 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar94._4_4_ = auVar92._4_4_ * auVar79._4_4_;
  auVar94._0_4_ = auVar92._0_4_ * auVar79._0_4_;
  auVar94._8_4_ = auVar92._8_4_ * auVar79._8_4_;
  auVar94._12_4_ = auVar92._12_4_ * auVar79._12_4_;
  auVar94._16_4_ = auVar92._16_4_ * 0.0;
  auVar94._20_4_ = auVar92._20_4_ * 0.0;
  auVar94._24_4_ = auVar92._24_4_ * 0.0;
  auVar94._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar85._0_4_ = auVar79._0_4_ * auVar92._0_4_;
  auVar85._4_4_ = auVar79._4_4_ * auVar92._4_4_;
  auVar85._8_4_ = auVar79._8_4_ * auVar92._8_4_;
  auVar85._12_4_ = auVar79._12_4_ * auVar92._12_4_;
  auVar85._16_4_ = auVar92._16_4_ * 0.0;
  auVar85._20_4_ = auVar92._20_4_ * 0.0;
  auVar85._24_4_ = auVar92._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar100,auVar97);
  auVar88 = vpminsd_avx2(auVar99,auVar95);
  auVar92 = vmaxps_avx(auVar92,auVar88);
  auVar88 = vpminsd_avx2(auVar94,auVar85);
  uVar133 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar89._4_4_ = uVar133;
  auVar89._0_4_ = uVar133;
  auVar89._8_4_ = uVar133;
  auVar89._12_4_ = uVar133;
  auVar89._16_4_ = uVar133;
  auVar89._20_4_ = uVar133;
  auVar89._24_4_ = uVar133;
  auVar89._28_4_ = uVar133;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar92 = vmaxps_avx(auVar92,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar92,auVar88);
  auVar92 = vpmaxsd_avx2(auVar100,auVar97);
  auVar88 = vpmaxsd_avx2(auVar99,auVar95);
  auVar92 = vminps_avx(auVar92,auVar88);
  auVar88 = vpmaxsd_avx2(auVar94,auVar85);
  fVar157 = ray->tfar;
  auVar90._4_4_ = fVar157;
  auVar90._0_4_ = fVar157;
  auVar90._8_4_ = fVar157;
  auVar90._12_4_ = fVar157;
  auVar90._16_4_ = fVar157;
  auVar90._20_4_ = fVar157;
  auVar90._24_4_ = fVar157;
  auVar90._28_4_ = fVar157;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar92 = vminps_avx(auVar92,auVar88);
  auVar93._8_4_ = 0x3f800003;
  auVar93._0_8_ = 0x3f8000033f800003;
  auVar93._12_4_ = 0x3f800003;
  auVar93._16_4_ = 0x3f800003;
  auVar93._20_4_ = 0x3f800003;
  auVar93._24_4_ = 0x3f800003;
  auVar93._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar93);
  uVar138 = vcmpps_avx512vl(local_80,auVar92,2);
  uVar22 = vpcmpgtd_avx512vl(auVar91,_DAT_01fb4ba0);
  local_388 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),(uint)(byte)((byte)uVar138 & (byte)uVar22));
  local_538 = ray;
  local_540 = prim;
  while (local_388 != 0) {
    lVar72 = 0;
    for (uVar69 = local_388; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar72 = lVar72 + 1;
    }
    local_530 = (ulong)*(uint *)(local_540 + 2);
    pGVar13 = (context->scene->geometries).items[*(uint *)(local_540 + 2)].ptr;
    local_488 = (ulong)*(uint *)(local_540 + lVar72 * 4 + 6);
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                             pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(local_540 + lVar72 * 4 + 6));
    p_Var14 = pGVar13[1].intersectionFilterN;
    lVar72 = *(long *)&pGVar13[1].time_range.upper;
    local_3f0 = *(undefined1 (*) [16])(lVar72 + (long)p_Var14 * uVar69);
    local_400 = *(undefined1 (*) [16])(lVar72 + (uVar69 + 1) * (long)p_Var14);
    pauVar3 = (undefined1 (*) [16])(lVar72 + (uVar69 + 2) * (long)p_Var14);
    auVar78 = *pauVar3;
    local_510 = *(undefined8 *)*pauVar3;
    uStack_508 = *(undefined8 *)(*pauVar3 + 8);
    uVar73 = local_388 - 1 & local_388;
    pauVar4 = (undefined1 (*) [12])(lVar72 + (uVar69 + 3) * (long)p_Var14);
    local_3a0 = (float)*(undefined8 *)*pauVar4;
    fStack_39c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_398 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_394 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar73 != 0) {
      uVar70 = uVar73 - 1 & uVar73;
      for (uVar69 = uVar73; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
      if (uVar70 != 0) {
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (local_538->org).field_0;
    auVar79 = vsubps_avx(local_3f0,(undefined1  [16])aVar5);
    uVar133 = auVar79._0_4_;
    auVar81._4_4_ = uVar133;
    auVar81._0_4_ = uVar133;
    auVar81._8_4_ = uVar133;
    auVar81._12_4_ = uVar133;
    auVar80 = vshufps_avx(auVar79,auVar79,0x55);
    aVar6 = (local_520->ray_space).vx.field_0;
    aVar7 = (local_520->ray_space).vy.field_0;
    fVar157 = (local_520->ray_space).vz.field_0.m128[0];
    fVar140 = (local_520->ray_space).vz.field_0.m128[1];
    fVar137 = (local_520->ray_space).vz.field_0.m128[2];
    fVar75 = (local_520->ray_space).vz.field_0.m128[3];
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar161._0_4_ = auVar79._0_4_ * fVar157;
    auVar161._4_4_ = auVar79._4_4_ * fVar140;
    auVar161._8_4_ = auVar79._8_4_ * fVar137;
    auVar161._12_4_ = auVar79._12_4_ * fVar75;
    auVar80 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar7,auVar80);
    auVar9 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar6,auVar81);
    auVar80 = vshufps_avx(local_3f0,local_3f0,0xff);
    auVar134 = vsubps_avx(local_400,(undefined1  [16])aVar5);
    uVar133 = auVar134._0_4_;
    auVar141._4_4_ = uVar133;
    auVar141._0_4_ = uVar133;
    auVar141._8_4_ = uVar133;
    auVar141._12_4_ = uVar133;
    auVar79 = vshufps_avx(auVar134,auVar134,0x55);
    auVar134 = vshufps_avx(auVar134,auVar134,0xaa);
    auVar163._0_4_ = auVar134._0_4_ * fVar157;
    auVar163._4_4_ = auVar134._4_4_ * fVar140;
    auVar163._8_4_ = auVar134._8_4_ * fVar137;
    auVar163._12_4_ = auVar134._12_4_ * fVar75;
    auVar79 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar7,auVar79);
    auVar10 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar141);
    auVar79 = vshufps_avx(local_400,local_400,0xff);
    auVar8 = vsubps_avx(auVar78,(undefined1  [16])aVar5);
    uVar133 = auVar8._0_4_;
    auVar158._4_4_ = uVar133;
    auVar158._0_4_ = uVar133;
    auVar158._8_4_ = uVar133;
    auVar158._12_4_ = uVar133;
    auVar134 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar165._0_4_ = auVar8._0_4_ * fVar157;
    auVar165._4_4_ = auVar8._4_4_ * fVar140;
    auVar165._8_4_ = auVar8._8_4_ * fVar137;
    auVar165._12_4_ = auVar8._12_4_ * fVar75;
    auVar134 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar7,auVar134);
    auVar8 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar6,auVar158);
    auVar77 = vshufps_avx512vl(auVar78,auVar78,0xff);
    auVar21._12_4_ = fStack_394;
    auVar21._0_12_ = *pauVar4;
    local_2e0 = ZEXT1632((undefined1  [16])aVar5);
    auVar134 = vsubps_avx(auVar21,(undefined1  [16])aVar5);
    uVar133 = auVar134._0_4_;
    auVar159._4_4_ = uVar133;
    auVar159._0_4_ = uVar133;
    auVar159._8_4_ = uVar133;
    auVar159._12_4_ = uVar133;
    auVar78 = vshufps_avx(auVar134,auVar134,0x55);
    auVar134 = vshufps_avx(auVar134,auVar134,0xaa);
    auVar166._0_4_ = auVar134._0_4_ * fVar157;
    auVar166._4_4_ = auVar134._4_4_ * fVar140;
    auVar166._8_4_ = auVar134._8_4_ * fVar137;
    auVar166._12_4_ = auVar134._12_4_ * fVar75;
    auVar78 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar7,auVar78);
    auVar134 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar6,auVar159);
    local_548 = (long)iVar12;
    lVar72 = local_548 * 0x44;
    auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72);
    uVar133 = auVar9._0_4_;
    local_340._4_4_ = uVar133;
    local_340._0_4_ = uVar133;
    local_340._8_4_ = uVar133;
    local_340._12_4_ = uVar133;
    local_340._16_4_ = uVar133;
    local_340._20_4_ = uVar133;
    local_340._24_4_ = uVar133;
    local_340._28_4_ = uVar133;
    auVar135._8_4_ = 1;
    auVar135._0_8_ = 0x100000001;
    auVar135._12_4_ = 1;
    auVar135._16_4_ = 1;
    auVar135._20_4_ = 1;
    auVar135._24_4_ = 1;
    auVar135._28_4_ = 1;
    local_360 = vpermps_avx512vl(auVar135,ZEXT1632(auVar9));
    auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x484);
    local_380 = vbroadcastss_avx512vl(auVar10);
    local_3c0 = vpermps_avx512vl(auVar135,ZEXT1632(auVar10));
    auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x908);
    local_440 = vbroadcastss_avx512vl(auVar8);
    local_460 = vpermps_avx512vl(auVar135,ZEXT1632(auVar8));
    auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0xd8c);
    fVar157 = auVar134._0_4_;
    local_3e0._4_4_ = fVar157;
    local_3e0._0_4_ = fVar157;
    local_3e0._8_4_ = fVar157;
    local_3e0._12_4_ = fVar157;
    local_3e0._16_4_ = fVar157;
    local_3e0._20_4_ = fVar157;
    local_3e0._24_4_ = fVar157;
    local_3e0._28_4_ = fVar157;
    local_480 = vpermps_avx512vl(auVar135,ZEXT1632(auVar134));
    auVar93 = vmulps_avx512vl(local_3e0,auVar90);
    auVar91 = vmulps_avx512vl(local_480,auVar90);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_440);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_460);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_380);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_3c0);
    auVar94 = vfmadd231ps_avx512vl(auVar93,auVar92,local_340);
    auVar86 = vfmadd231ps_avx512vl(auVar91,auVar92,local_360);
    auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72);
    auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x484);
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x908);
    auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0xd8c);
    auVar87 = vmulps_avx512vl(local_3e0,auVar99);
    auVar82 = vmulps_avx512vl(local_480,auVar99);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,local_440);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar100,local_460);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_380);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar91,local_3c0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_340);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,local_360);
    auVar83 = vsubps_avx512vl(auVar87,auVar94);
    auVar84 = vsubps_avx512vl(auVar82,auVar86);
    auVar85 = vmulps_avx512vl(auVar86,auVar83);
    auVar95 = vmulps_avx512vl(auVar94,auVar84);
    auVar85 = vsubps_avx512vl(auVar85,auVar95);
    auVar78 = vshufps_avx512vl(auVar21,auVar21,0xff);
    uVar138 = auVar80._0_8_;
    local_a0._8_8_ = uVar138;
    local_a0._0_8_ = uVar138;
    local_a0._16_8_ = uVar138;
    local_a0._24_8_ = uVar138;
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    local_e0 = vbroadcastsd_avx512vl(auVar77);
    _local_100 = vbroadcastsd_avx512vl(auVar78);
    auVar95 = vmulps_avx512vl(_local_100,auVar90);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,local_e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,local_c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_a0);
    auVar96 = vmulps_avx512vl(_local_100,auVar99);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_e0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_a0);
    auVar97 = vmulps_avx512vl(auVar84,auVar84);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar83,auVar83);
    auVar98 = vmaxps_avx512vl(auVar95,auVar96);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar85 = vmulps_avx512vl(auVar85,auVar85);
    uVar138 = vcmpps_avx512vl(auVar85,auVar97,2);
    auVar78 = vblendps_avx(auVar9,local_3f0,8);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar80 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vblendps_avx(auVar10,local_400,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar80 = vmaxps_avx(auVar80,auVar78);
    auVar78 = vblendps_avx(auVar8,*pauVar3,8);
    auVar77 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vblendps_avx(auVar134,auVar21,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx(auVar77,auVar78);
    auVar78 = vmaxps_avx(auVar80,auVar78);
    auVar80 = vmovshdup_avx(auVar78);
    auVar80 = vmaxss_avx(auVar80,auVar78);
    auVar78 = vshufpd_avx(auVar78,auVar78,1);
    auVar78 = vmaxss_avx(auVar78,auVar80);
    local_300._0_4_ = (undefined4)iVar12;
    register0x00001504 = auVar9._4_12_;
    auVar167._4_4_ = local_300._0_4_;
    auVar167._0_4_ = local_300._0_4_;
    auVar167._8_4_ = local_300._0_4_;
    auVar167._12_4_ = local_300._0_4_;
    auVar167._16_4_ = local_300._0_4_;
    auVar167._20_4_ = local_300._0_4_;
    auVar167._24_4_ = local_300._0_4_;
    auVar167._28_4_ = local_300._0_4_;
    uVar22 = vcmpps_avx512vl(auVar167,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar138 & (byte)uVar22;
    auVar78 = vmulss_avx512f(auVar78,ZEXT416(0x35000000));
    auVar150._8_4_ = 2;
    auVar150._0_8_ = 0x200000002;
    auVar150._12_4_ = 2;
    auVar150._16_4_ = 2;
    auVar150._20_4_ = 2;
    auVar150._24_4_ = 2;
    auVar150._28_4_ = 2;
    local_320 = vpermps_avx2(auVar150,ZEXT1632(auVar9));
    local_120 = vpermps_avx512vl(auVar150,ZEXT1632(auVar10));
    local_140 = vpermps_avx512vl(auVar150,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar150,ZEXT1632(auVar134));
    if (bVar74 == 0) {
      bVar71 = false;
      auVar80 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
      auVar173 = ZEXT1664(auVar80);
      auVar174 = ZEXT3264(local_340);
      auVar175 = ZEXT3264(local_360);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar180 = ZEXT3264(auVar92);
      auVar177 = ZEXT3264(local_380);
      auVar179 = ZEXT3264(local_3c0);
      auVar176 = ZEXT3264(local_440);
      auVar178 = ZEXT3264(local_460);
      auVar172 = ZEXT3264(local_3e0);
      auVar181 = ZEXT3264(local_480);
    }
    else {
      auVar99 = vmulps_avx512vl(local_160,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
      auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar100);
      auVar91 = vfmadd213ps_avx512vl(auVar93,local_320,auVar91);
      auVar90 = vmulps_avx512vl(local_160,auVar90);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
      auVar99 = vfmadd213ps_avx512vl(auVar88,local_120,auVar89);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1210);
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1694);
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1b18);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1f9c);
      auVar99 = vfmadd213ps_avx512vl(auVar92,local_320,auVar99);
      auVar92 = vmulps_avx512vl(local_3e0,auVar93);
      auVar85 = vmulps_avx512vl(local_480,auVar93);
      auVar93 = vmulps_avx512vl(local_160,auVar93);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_440);
      auVar80 = vfmadd231ps_fma(auVar85,auVar90,local_460);
      auVar90 = vfmadd231ps_avx512vl(auVar93,local_140,auVar90);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_380);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar89,local_3c0);
      auVar85 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
      auVar174 = ZEXT3264(local_340);
      auVar97 = vfmadd231ps_avx512vl(auVar92,auVar88,local_340);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_360);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1210);
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1b18);
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1f9c);
      auVar80 = vfmadd231ps_fma(auVar85,local_320,auVar88);
      auVar30._4_4_ = fVar157 * auVar90._4_4_;
      auVar30._0_4_ = fVar157 * auVar90._0_4_;
      auVar30._8_4_ = fVar157 * auVar90._8_4_;
      auVar30._12_4_ = fVar157 * auVar90._12_4_;
      auVar30._16_4_ = fVar157 * auVar90._16_4_;
      auVar30._20_4_ = fVar157 * auVar90._20_4_;
      auVar30._24_4_ = fVar157 * auVar90._24_4_;
      auVar30._28_4_ = auVar88._28_4_;
      auVar88 = vmulps_avx512vl(local_480,auVar90);
      auVar90 = vmulps_avx512vl(local_160,auVar90);
      auVar85 = vfmadd231ps_avx512vl(auVar30,auVar89,local_440);
      auVar79 = vfmadd231ps_fma(auVar88,auVar89,local_460);
      auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1694);
      auVar90 = vfmadd231ps_avx512vl(auVar85,auVar88,local_380);
      auVar85 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar88,local_3c0);
      auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
      auVar89 = vfmadd231ps_avx512vl(auVar90,auVar92,local_340);
      auVar90 = vfmadd231ps_avx512vl(auVar85,auVar92,local_360);
      auVar79 = vfmadd231ps_fma(auVar88,local_320,auVar92);
      auVar170._8_4_ = 0x7fffffff;
      auVar170._0_8_ = 0x7fffffff7fffffff;
      auVar170._12_4_ = 0x7fffffff;
      auVar170._16_4_ = 0x7fffffff;
      auVar170._20_4_ = 0x7fffffff;
      auVar170._24_4_ = 0x7fffffff;
      auVar170._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(auVar97,auVar170);
      auVar88 = vandps_avx(auVar93,auVar170);
      auVar88 = vmaxps_avx(auVar92,auVar88);
      auVar92 = vandps_avx(ZEXT1632(auVar80),auVar170);
      auVar92 = vmaxps_avx(auVar88,auVar92);
      auVar85 = vbroadcastss_avx512vl(auVar78);
      uVar69 = vcmpps_avx512vl(auVar92,auVar85,1);
      bVar71 = (bool)((byte)uVar69 & 1);
      auVar101._0_4_ = (float)((uint)bVar71 * auVar83._0_4_ | (uint)!bVar71 * auVar97._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar71 * auVar83._4_4_ | (uint)!bVar71 * auVar97._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar71 * auVar83._8_4_ | (uint)!bVar71 * auVar97._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar71 * auVar83._12_4_ | (uint)!bVar71 * auVar97._12_4_);
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar71 * auVar83._16_4_ | (uint)!bVar71 * auVar97._16_4_);
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar71 * auVar83._20_4_ | (uint)!bVar71 * auVar97._20_4_);
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar71 * auVar83._24_4_ | (uint)!bVar71 * auVar97._24_4_);
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar101._28_4_ = (uint)bVar71 * auVar83._28_4_ | (uint)!bVar71 * auVar97._28_4_;
      bVar71 = (bool)((byte)uVar69 & 1);
      auVar102._0_4_ = (float)((uint)bVar71 * auVar84._0_4_ | (uint)!bVar71 * auVar93._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar71 * auVar84._4_4_ | (uint)!bVar71 * auVar93._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar71 * auVar84._8_4_ | (uint)!bVar71 * auVar93._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar71 * auVar84._12_4_ | (uint)!bVar71 * auVar93._12_4_);
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar71 * auVar84._16_4_ | (uint)!bVar71 * auVar93._16_4_);
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar71 * auVar84._20_4_ | (uint)!bVar71 * auVar93._20_4_);
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar71 * auVar84._24_4_ | (uint)!bVar71 * auVar93._24_4_);
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar102._28_4_ = (uint)bVar71 * auVar84._28_4_ | (uint)!bVar71 * auVar93._28_4_;
      auVar92 = vandps_avx(auVar170,auVar89);
      auVar88 = vandps_avx(auVar90,auVar170);
      auVar88 = vmaxps_avx(auVar92,auVar88);
      auVar92 = vandps_avx(ZEXT1632(auVar79),auVar170);
      auVar92 = vmaxps_avx(auVar88,auVar92);
      uVar69 = vcmpps_avx512vl(auVar92,auVar85,1);
      bVar71 = (bool)((byte)uVar69 & 1);
      auVar103._0_4_ = (float)((uint)bVar71 * auVar83._0_4_ | (uint)!bVar71 * auVar89._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar71 * auVar83._4_4_ | (uint)!bVar71 * auVar89._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar71 * auVar83._8_4_ | (uint)!bVar71 * auVar89._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar71 * auVar83._12_4_ | (uint)!bVar71 * auVar89._12_4_);
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar71 * auVar83._16_4_ | (uint)!bVar71 * auVar89._16_4_);
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar71 * auVar83._20_4_ | (uint)!bVar71 * auVar89._20_4_);
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar71 * auVar83._24_4_ | (uint)!bVar71 * auVar89._24_4_);
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar103._28_4_ = (uint)bVar71 * auVar83._28_4_ | (uint)!bVar71 * auVar89._28_4_;
      bVar71 = (bool)((byte)uVar69 & 1);
      auVar104._0_4_ = (float)((uint)bVar71 * auVar84._0_4_ | (uint)!bVar71 * auVar90._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar71 * auVar84._4_4_ | (uint)!bVar71 * auVar90._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar71 * auVar84._8_4_ | (uint)!bVar71 * auVar90._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar71 * auVar84._12_4_ | (uint)!bVar71 * auVar90._12_4_);
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar71 * auVar84._16_4_ | (uint)!bVar71 * auVar90._16_4_);
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar71 * auVar84._20_4_ | (uint)!bVar71 * auVar90._20_4_);
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar71 * auVar84._24_4_ | (uint)!bVar71 * auVar90._24_4_);
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar104._28_4_ = (uint)bVar71 * auVar84._28_4_ | (uint)!bVar71 * auVar90._28_4_;
      auVar81 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
      auVar173 = ZEXT1664(auVar81);
      auVar92 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar81));
      auVar80 = vfmadd231ps_fma(auVar92,auVar102,auVar102);
      auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
      fVar157 = auVar92._0_4_;
      fVar140 = auVar92._4_4_;
      fVar137 = auVar92._8_4_;
      fVar75 = auVar92._12_4_;
      fVar76 = auVar92._16_4_;
      fVar122 = auVar92._20_4_;
      fVar123 = auVar92._24_4_;
      auVar31._4_4_ = fVar140 * fVar140 * fVar140 * auVar80._4_4_ * -0.5;
      auVar31._0_4_ = fVar157 * fVar157 * fVar157 * auVar80._0_4_ * -0.5;
      auVar31._8_4_ = fVar137 * fVar137 * fVar137 * auVar80._8_4_ * -0.5;
      auVar31._12_4_ = fVar75 * fVar75 * fVar75 * auVar80._12_4_ * -0.5;
      auVar31._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar31._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
      auVar31._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar31._28_4_ = 0;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar89 = vfmadd231ps_avx512vl(auVar31,auVar88,auVar92);
      auVar32._4_4_ = auVar102._4_4_ * auVar89._4_4_;
      auVar32._0_4_ = auVar102._0_4_ * auVar89._0_4_;
      auVar32._8_4_ = auVar102._8_4_ * auVar89._8_4_;
      auVar32._12_4_ = auVar102._12_4_ * auVar89._12_4_;
      auVar32._16_4_ = auVar102._16_4_ * auVar89._16_4_;
      auVar32._20_4_ = auVar102._20_4_ * auVar89._20_4_;
      auVar32._24_4_ = auVar102._24_4_ * auVar89._24_4_;
      auVar32._28_4_ = auVar92._28_4_;
      auVar33._4_4_ = auVar89._4_4_ * -auVar101._4_4_;
      auVar33._0_4_ = auVar89._0_4_ * -auVar101._0_4_;
      auVar33._8_4_ = auVar89._8_4_ * -auVar101._8_4_;
      auVar33._12_4_ = auVar89._12_4_ * -auVar101._12_4_;
      auVar33._16_4_ = auVar89._16_4_ * -auVar101._16_4_;
      auVar33._20_4_ = auVar89._20_4_ * -auVar101._20_4_;
      auVar33._24_4_ = auVar89._24_4_ * -auVar101._24_4_;
      auVar33._28_4_ = auVar101._28_4_ ^ 0x80000000;
      auVar92 = vmulps_avx512vl(auVar89,ZEXT1632(auVar81));
      auVar83 = ZEXT1632(auVar81);
      auVar90 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar83);
      auVar80 = vfmadd231ps_fma(auVar90,auVar104,auVar104);
      auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
      fVar157 = auVar90._0_4_;
      fVar140 = auVar90._4_4_;
      fVar137 = auVar90._8_4_;
      fVar75 = auVar90._12_4_;
      fVar76 = auVar90._16_4_;
      fVar122 = auVar90._20_4_;
      fVar123 = auVar90._24_4_;
      auVar34._4_4_ = fVar140 * fVar140 * fVar140 * auVar80._4_4_ * -0.5;
      auVar34._0_4_ = fVar157 * fVar157 * fVar157 * auVar80._0_4_ * -0.5;
      auVar34._8_4_ = fVar137 * fVar137 * fVar137 * auVar80._8_4_ * -0.5;
      auVar34._12_4_ = fVar75 * fVar75 * fVar75 * auVar80._12_4_ * -0.5;
      auVar34._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar34._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
      auVar34._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar34._28_4_ = 0;
      auVar88 = vfmadd231ps_avx512vl(auVar34,auVar88,auVar90);
      auVar35._4_4_ = auVar104._4_4_ * auVar88._4_4_;
      auVar35._0_4_ = auVar104._0_4_ * auVar88._0_4_;
      auVar35._8_4_ = auVar104._8_4_ * auVar88._8_4_;
      auVar35._12_4_ = auVar104._12_4_ * auVar88._12_4_;
      auVar35._16_4_ = auVar104._16_4_ * auVar88._16_4_;
      auVar35._20_4_ = auVar104._20_4_ * auVar88._20_4_;
      auVar35._24_4_ = auVar104._24_4_ * auVar88._24_4_;
      auVar35._28_4_ = auVar90._28_4_;
      auVar36._4_4_ = -auVar103._4_4_ * auVar88._4_4_;
      auVar36._0_4_ = -auVar103._0_4_ * auVar88._0_4_;
      auVar36._8_4_ = -auVar103._8_4_ * auVar88._8_4_;
      auVar36._12_4_ = -auVar103._12_4_ * auVar88._12_4_;
      auVar36._16_4_ = -auVar103._16_4_ * auVar88._16_4_;
      auVar36._20_4_ = -auVar103._20_4_ * auVar88._20_4_;
      auVar36._24_4_ = -auVar103._24_4_ * auVar88._24_4_;
      auVar36._28_4_ = auVar89._28_4_;
      auVar88 = vmulps_avx512vl(auVar88,auVar83);
      auVar80 = vfmadd213ps_fma(auVar32,auVar95,auVar94);
      auVar79 = vfmadd213ps_fma(auVar33,auVar95,auVar86);
      auVar89 = vfmadd213ps_avx512vl(auVar92,auVar95,auVar99);
      auVar90 = vfmadd213ps_avx512vl(auVar35,auVar96,auVar87);
      auVar10 = vfnmadd213ps_fma(auVar32,auVar95,auVar94);
      auVar134 = vfmadd213ps_fma(auVar36,auVar96,auVar82);
      auVar77 = vfnmadd213ps_fma(auVar33,auVar95,auVar86);
      auVar93 = vfmadd213ps_avx512vl(auVar88,auVar96,auVar91);
      auVar100 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar92);
      auVar11 = vfnmadd213ps_fma(auVar35,auVar96,auVar87);
      auVar21 = vfnmadd213ps_fma(auVar36,auVar96,auVar82);
      auVar88 = vfnmadd231ps_avx512vl(auVar91,auVar96,auVar88);
      auVar91 = vsubps_avx512vl(auVar90,ZEXT1632(auVar10));
      auVar92 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar77));
      auVar99 = vsubps_avx512vl(auVar93,auVar100);
      auVar94 = vmulps_avx512vl(auVar92,auVar100);
      auVar8 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar77),auVar99);
      auVar37._4_4_ = auVar10._4_4_ * auVar99._4_4_;
      auVar37._0_4_ = auVar10._0_4_ * auVar99._0_4_;
      auVar37._8_4_ = auVar10._8_4_ * auVar99._8_4_;
      auVar37._12_4_ = auVar10._12_4_ * auVar99._12_4_;
      auVar37._16_4_ = auVar99._16_4_ * 0.0;
      auVar37._20_4_ = auVar99._20_4_ * 0.0;
      auVar37._24_4_ = auVar99._24_4_ * 0.0;
      auVar37._28_4_ = auVar99._28_4_;
      auVar99 = vfmsub231ps_avx512vl(auVar37,auVar100,auVar91);
      auVar38._4_4_ = auVar77._4_4_ * auVar91._4_4_;
      auVar38._0_4_ = auVar77._0_4_ * auVar91._0_4_;
      auVar38._8_4_ = auVar77._8_4_ * auVar91._8_4_;
      auVar38._12_4_ = auVar77._12_4_ * auVar91._12_4_;
      auVar38._16_4_ = auVar91._16_4_ * 0.0;
      auVar38._20_4_ = auVar91._20_4_ * 0.0;
      auVar38._24_4_ = auVar91._24_4_ * 0.0;
      auVar38._28_4_ = auVar91._28_4_;
      auVar9 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar10),auVar92);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar83,auVar99);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,ZEXT1632(auVar8));
      auVar83 = ZEXT1632(auVar81);
      uVar69 = vcmpps_avx512vl(auVar92,auVar83,2);
      bVar66 = (byte)uVar69;
      fVar75 = (float)((uint)(bVar66 & 1) * auVar80._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar11._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar122 = (float)((uint)bVar71 * auVar80._4_4_ | (uint)!bVar71 * auVar11._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar126 = (float)((uint)bVar71 * auVar80._8_4_ | (uint)!bVar71 * auVar11._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar129 = (float)((uint)bVar71 * auVar80._12_4_ | (uint)!bVar71 * auVar11._12_4_);
      auVar91 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar122,fVar75))));
      fVar76 = (float)((uint)(bVar66 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar21._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar123 = (float)((uint)bVar71 * auVar79._4_4_ | (uint)!bVar71 * auVar21._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar145 = (float)((uint)bVar71 * auVar79._8_4_ | (uint)!bVar71 * auVar21._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar130 = (float)((uint)bVar71 * auVar79._12_4_ | (uint)!bVar71 * auVar21._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar145,CONCAT44(fVar123,fVar76))));
      auVar105._0_4_ =
           (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_;
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar71 * auVar89._4_4_ | (uint)!bVar71 * auVar88._4_4_;
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar71 * auVar89._8_4_ | (uint)!bVar71 * auVar88._8_4_;
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar71 * auVar89._12_4_ | (uint)!bVar71 * auVar88._12_4_;
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar105._16_4_ = (uint)bVar71 * auVar89._16_4_ | (uint)!bVar71 * auVar88._16_4_;
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar105._20_4_ = (uint)bVar71 * auVar89._20_4_ | (uint)!bVar71 * auVar88._20_4_;
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar105._24_4_ = (uint)bVar71 * auVar89._24_4_ | (uint)!bVar71 * auVar88._24_4_;
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar105._28_4_ = (uint)bVar71 * auVar89._28_4_ | (uint)!bVar71 * auVar88._28_4_;
      auVar88 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar90);
      auVar106._0_4_ = (uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar8._0_4_
      ;
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar71 * auVar88._4_4_ | (uint)!bVar71 * auVar8._4_4_;
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar71 * auVar88._8_4_ | (uint)!bVar71 * auVar8._8_4_;
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar71 * auVar88._12_4_ | (uint)!bVar71 * auVar8._12_4_;
      auVar106._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar88._16_4_;
      auVar106._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar88._20_4_;
      auVar106._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar88._24_4_;
      auVar106._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar88._28_4_;
      auVar88 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar134));
      auVar107._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar79._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar71 * auVar88._4_4_ | (uint)!bVar71 * auVar79._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar71 * auVar88._8_4_ | (uint)!bVar71 * auVar79._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar71 * auVar88._12_4_ | (uint)!bVar71 * auVar79._12_4_);
      fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar88._16_4_);
      auVar107._16_4_ = fVar157;
      fVar140 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar88._20_4_);
      auVar107._20_4_ = fVar140;
      fVar137 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar88._24_4_);
      auVar107._24_4_ = fVar137;
      auVar107._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar88._28_4_;
      auVar88 = vblendmps_avx512vl(auVar100,auVar93);
      auVar108._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar89._0_4_);
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar71 * auVar88._4_4_ | (uint)!bVar71 * auVar89._4_4_);
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar71 * auVar88._8_4_ | (uint)!bVar71 * auVar89._8_4_);
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar71 * auVar88._12_4_ | (uint)!bVar71 * auVar89._12_4_);
      bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar71 * auVar88._16_4_ | (uint)!bVar71 * auVar89._16_4_);
      bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar71 * auVar88._20_4_ | (uint)!bVar71 * auVar89._20_4_);
      bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar71 * auVar88._24_4_ | (uint)!bVar71 * auVar89._24_4_);
      bVar71 = SUB81(uVar69 >> 7,0);
      auVar108._28_4_ = (uint)bVar71 * auVar88._28_4_ | (uint)!bVar71 * auVar89._28_4_;
      auVar109._0_4_ =
           (uint)(bVar66 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar90._0_4_;
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar71 * (int)auVar10._4_4_ | (uint)!bVar71 * auVar90._4_4_;
      bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar71 * (int)auVar10._8_4_ | (uint)!bVar71 * auVar90._8_4_;
      bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar71 * (int)auVar10._12_4_ | (uint)!bVar71 * auVar90._12_4_;
      auVar109._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar90._16_4_;
      auVar109._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar90._20_4_;
      auVar109._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar90._24_4_;
      auVar109._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar90._28_4_;
      bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar110._0_4_ =
           (uint)(bVar66 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar93._0_4_;
      bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar93._4_4_;
      bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar93._8_4_;
      bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar93._12_4_;
      bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar93._16_4_;
      bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar93._20_4_;
      bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar93._24_4_;
      bVar15 = SUB81(uVar69 >> 7,0);
      auVar110._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar93._28_4_;
      auVar93 = vsubps_avx512vl(auVar109,auVar91);
      auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar77._12_4_ |
                                              (uint)!bVar18 * auVar134._12_4_,
                                              CONCAT48((uint)bVar16 * (int)auVar77._8_4_ |
                                                       (uint)!bVar16 * auVar134._8_4_,
                                                       CONCAT44((uint)bVar71 * (int)auVar77._4_4_ |
                                                                (uint)!bVar71 * auVar134._4_4_,
                                                                (uint)(bVar66 & 1) *
                                                                (int)auVar77._0_4_ |
                                                                (uint)!(bool)(bVar66 & 1) *
                                                                auVar134._0_4_)))),auVar99);
      auVar100 = vsubps_avx512vl(auVar110,auVar105);
      auVar89 = vsubps_avx(auVar91,auVar106);
      auVar90 = vsubps_avx(auVar99,auVar107);
      auVar94 = vsubps_avx512vl(auVar105,auVar108);
      auVar39._4_4_ = auVar100._4_4_ * fVar122;
      auVar39._0_4_ = auVar100._0_4_ * fVar75;
      auVar39._8_4_ = auVar100._8_4_ * fVar126;
      auVar39._12_4_ = auVar100._12_4_ * fVar129;
      auVar39._16_4_ = auVar100._16_4_ * 0.0;
      auVar39._20_4_ = auVar100._20_4_ * 0.0;
      auVar39._24_4_ = auVar100._24_4_ * 0.0;
      auVar39._28_4_ = auVar110._28_4_;
      auVar86 = vfmsub231ps_avx512vl(auVar39,auVar105,auVar93);
      auVar40._4_4_ = fVar123 * auVar93._4_4_;
      auVar40._0_4_ = fVar76 * auVar93._0_4_;
      auVar40._8_4_ = fVar145 * auVar93._8_4_;
      auVar40._12_4_ = fVar130 * auVar93._12_4_;
      auVar40._16_4_ = auVar93._16_4_ * 0.0;
      auVar40._20_4_ = auVar93._20_4_ * 0.0;
      auVar40._24_4_ = auVar93._24_4_ * 0.0;
      auVar40._28_4_ = auVar92._28_4_;
      auVar80 = vfmsub231ps_fma(auVar40,auVar91,auVar88);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar83,auVar86);
      auVar86 = vmulps_avx512vl(auVar88,auVar105);
      auVar80 = vfmsub231ps_fma(auVar86,auVar99,auVar100);
      auVar86 = vfmadd231ps_avx512vl(auVar92,auVar83,ZEXT1632(auVar80));
      auVar92 = vmulps_avx512vl(auVar94,auVar106);
      auVar92 = vfmsub231ps_avx512vl(auVar92,auVar89,auVar108);
      auVar41._4_4_ = auVar90._4_4_ * auVar108._4_4_;
      auVar41._0_4_ = auVar90._0_4_ * auVar108._0_4_;
      auVar41._8_4_ = auVar90._8_4_ * auVar108._8_4_;
      auVar41._12_4_ = auVar90._12_4_ * auVar108._12_4_;
      auVar41._16_4_ = auVar90._16_4_ * auVar108._16_4_;
      auVar41._20_4_ = auVar90._20_4_ * auVar108._20_4_;
      auVar41._24_4_ = auVar90._24_4_ * auVar108._24_4_;
      auVar41._28_4_ = auVar108._28_4_;
      auVar80 = vfmsub231ps_fma(auVar41,auVar107,auVar94);
      auVar152._0_4_ = auVar107._0_4_ * auVar89._0_4_;
      auVar152._4_4_ = auVar107._4_4_ * auVar89._4_4_;
      auVar152._8_4_ = auVar107._8_4_ * auVar89._8_4_;
      auVar152._12_4_ = auVar107._12_4_ * auVar89._12_4_;
      auVar152._16_4_ = fVar157 * auVar89._16_4_;
      auVar152._20_4_ = fVar140 * auVar89._20_4_;
      auVar152._24_4_ = fVar137 * auVar89._24_4_;
      auVar152._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar152,auVar90,auVar106);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar83,auVar92);
      auVar87 = vfmadd231ps_avx512vl(auVar92,auVar83,ZEXT1632(auVar80));
      auVar92 = vmaxps_avx(auVar86,auVar87);
      uVar138 = vcmpps_avx512vl(auVar92,auVar83,2);
      bVar74 = bVar74 & (byte)uVar138;
      auVar175 = ZEXT3264(local_360);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar180 = ZEXT3264(auVar82);
      auVar177 = ZEXT3264(local_380);
      auVar179 = ZEXT3264(local_3c0);
      auVar176 = ZEXT3264(local_440);
      auVar178 = ZEXT3264(local_460);
      auVar172 = ZEXT3264(local_3e0);
      auVar181 = ZEXT3264(local_480);
      if (bVar74 != 0) {
        auVar42._4_4_ = auVar94._4_4_ * auVar88._4_4_;
        auVar42._0_4_ = auVar94._0_4_ * auVar88._0_4_;
        auVar42._8_4_ = auVar94._8_4_ * auVar88._8_4_;
        auVar42._12_4_ = auVar94._12_4_ * auVar88._12_4_;
        auVar42._16_4_ = auVar94._16_4_ * auVar88._16_4_;
        auVar42._20_4_ = auVar94._20_4_ * auVar88._20_4_;
        auVar42._24_4_ = auVar94._24_4_ * auVar88._24_4_;
        auVar42._28_4_ = auVar92._28_4_;
        auVar134 = vfmsub231ps_fma(auVar42,auVar90,auVar100);
        auVar43._4_4_ = auVar100._4_4_ * auVar89._4_4_;
        auVar43._0_4_ = auVar100._0_4_ * auVar89._0_4_;
        auVar43._8_4_ = auVar100._8_4_ * auVar89._8_4_;
        auVar43._12_4_ = auVar100._12_4_ * auVar89._12_4_;
        auVar43._16_4_ = auVar100._16_4_ * auVar89._16_4_;
        auVar43._20_4_ = auVar100._20_4_ * auVar89._20_4_;
        auVar43._24_4_ = auVar100._24_4_ * auVar89._24_4_;
        auVar43._28_4_ = auVar100._28_4_;
        auVar79 = vfmsub231ps_fma(auVar43,auVar93,auVar94);
        auVar44._4_4_ = auVar90._4_4_ * auVar93._4_4_;
        auVar44._0_4_ = auVar90._0_4_ * auVar93._0_4_;
        auVar44._8_4_ = auVar90._8_4_ * auVar93._8_4_;
        auVar44._12_4_ = auVar90._12_4_ * auVar93._12_4_;
        auVar44._16_4_ = auVar90._16_4_ * auVar93._16_4_;
        auVar44._20_4_ = auVar90._20_4_ * auVar93._20_4_;
        auVar44._24_4_ = auVar90._24_4_ * auVar93._24_4_;
        auVar44._28_4_ = auVar90._28_4_;
        auVar8 = vfmsub231ps_fma(auVar44,auVar89,auVar88);
        auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar8));
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar134),auVar83);
        auVar92 = vrcp14ps_avx512vl(auVar88);
        auVar89 = vfnmadd213ps_avx512vl(auVar92,auVar88,auVar82);
        auVar80 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar105,ZEXT1632(auVar8));
        auVar79 = vfmadd231ps_fma(auVar92,auVar99,ZEXT1632(auVar79));
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar91,ZEXT1632(auVar134));
        fVar140 = auVar80._0_4_;
        fVar137 = auVar80._4_4_;
        fVar75 = auVar80._8_4_;
        fVar76 = auVar80._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar76,
                                       CONCAT48(auVar79._8_4_ * fVar75,
                                                CONCAT44(auVar79._4_4_ * fVar137,
                                                         auVar79._0_4_ * fVar140))));
        auVar160._8_4_ = 3;
        auVar160._0_8_ = 0x300000003;
        auVar160._12_4_ = 3;
        auVar160._16_4_ = 3;
        auVar160._20_4_ = 3;
        auVar160._24_4_ = 3;
        auVar160._28_4_ = 3;
        auVar92 = vpermps_avx2(auVar160,ZEXT1632((undefined1  [16])aVar5));
        uVar138 = vcmpps_avx512vl(auVar92,local_240,2);
        fVar157 = local_538->tfar;
        auVar23._4_4_ = fVar157;
        auVar23._0_4_ = fVar157;
        auVar23._8_4_ = fVar157;
        auVar23._12_4_ = fVar157;
        auVar23._16_4_ = fVar157;
        auVar23._20_4_ = fVar157;
        auVar23._24_4_ = fVar157;
        auVar23._28_4_ = fVar157;
        uVar22 = vcmpps_avx512vl(local_240,auVar23,2);
        bVar74 = (byte)uVar138 & (byte)uVar22 & bVar74;
        if (bVar74 != 0) {
          uVar138 = vcmpps_avx512vl(auVar88,auVar83,4);
          bVar74 = bVar74 & (byte)uVar138;
          if (bVar74 != 0) {
            fVar157 = auVar86._0_4_ * fVar140;
            fVar122 = auVar86._4_4_ * fVar137;
            auVar45._4_4_ = fVar122;
            auVar45._0_4_ = fVar157;
            fVar123 = auVar86._8_4_ * fVar75;
            auVar45._8_4_ = fVar123;
            fVar126 = auVar86._12_4_ * fVar76;
            auVar45._12_4_ = fVar126;
            fVar145 = auVar86._16_4_ * 0.0;
            auVar45._16_4_ = fVar145;
            fVar129 = auVar86._20_4_ * 0.0;
            auVar45._20_4_ = fVar129;
            fVar130 = auVar86._24_4_ * 0.0;
            auVar45._24_4_ = fVar130;
            auVar45._28_4_ = auVar88._28_4_;
            auVar92 = vsubps_avx512vl(auVar82,auVar45);
            local_280._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar157 |
                        (uint)!(bool)(bVar66 & 1) * auVar92._0_4_);
            bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar71 * (int)fVar122 | (uint)!bVar71 * auVar92._4_4_);
            bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar71 * (int)fVar123 | (uint)!bVar71 * auVar92._8_4_);
            bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar71 * (int)fVar126 | (uint)!bVar71 * auVar92._12_4_)
            ;
            bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar71 * (int)fVar145 | (uint)!bVar71 * auVar92._16_4_)
            ;
            bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar71 * (int)fVar129 | (uint)!bVar71 * auVar92._20_4_)
            ;
            bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar71 * (int)fVar130 | (uint)!bVar71 * auVar92._24_4_)
            ;
            bVar71 = SUB81(uVar69 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar71 * auVar88._28_4_ | (uint)!bVar71 * auVar92._28_4_);
            auVar92 = vsubps_avx(auVar96,auVar95);
            auVar80 = vfmadd213ps_fma(auVar92,local_280,auVar95);
            fVar157 = local_520->depth_scale;
            auVar24._4_4_ = fVar157;
            auVar24._0_4_ = fVar157;
            auVar24._8_4_ = fVar157;
            auVar24._12_4_ = fVar157;
            auVar24._16_4_ = fVar157;
            auVar24._20_4_ = fVar157;
            auVar24._24_4_ = fVar157;
            auVar24._28_4_ = fVar157;
            auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                         CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                  CONCAT44(auVar80._4_4_ +
                                                                           auVar80._4_4_,
                                                                           auVar80._0_4_ +
                                                                           auVar80._0_4_)))),auVar24
                                     );
            uVar138 = vcmpps_avx512vl(local_240,auVar92,6);
            if (((byte)uVar138 & bVar74) != 0) {
              auVar144._0_4_ = auVar87._0_4_ * fVar140;
              auVar144._4_4_ = auVar87._4_4_ * fVar137;
              auVar144._8_4_ = auVar87._8_4_ * fVar75;
              auVar144._12_4_ = auVar87._12_4_ * fVar76;
              auVar144._16_4_ = auVar87._16_4_ * 0.0;
              auVar144._20_4_ = auVar87._20_4_ * 0.0;
              auVar144._24_4_ = auVar87._24_4_ * 0.0;
              auVar144._28_4_ = 0;
              auVar92 = vsubps_avx512vl(auVar82,auVar144);
              auVar111._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar144._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar92._0_4_;
              bVar71 = (bool)((byte)(uVar69 >> 1) & 1);
              auVar111._4_4_ = (uint)bVar71 * (int)auVar144._4_4_ | (uint)!bVar71 * auVar92._4_4_;
              bVar71 = (bool)((byte)(uVar69 >> 2) & 1);
              auVar111._8_4_ = (uint)bVar71 * (int)auVar144._8_4_ | (uint)!bVar71 * auVar92._8_4_;
              bVar71 = (bool)((byte)(uVar69 >> 3) & 1);
              auVar111._12_4_ = (uint)bVar71 * (int)auVar144._12_4_ | (uint)!bVar71 * auVar92._12_4_
              ;
              bVar71 = (bool)((byte)(uVar69 >> 4) & 1);
              auVar111._16_4_ = (uint)bVar71 * (int)auVar144._16_4_ | (uint)!bVar71 * auVar92._16_4_
              ;
              bVar71 = (bool)((byte)(uVar69 >> 5) & 1);
              auVar111._20_4_ = (uint)bVar71 * (int)auVar144._20_4_ | (uint)!bVar71 * auVar92._20_4_
              ;
              bVar71 = (bool)((byte)(uVar69 >> 6) & 1);
              auVar111._24_4_ = (uint)bVar71 * (int)auVar144._24_4_ | (uint)!bVar71 * auVar92._24_4_
              ;
              auVar111._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar92._28_4_;
              auVar25._8_4_ = 0x40000000;
              auVar25._0_8_ = 0x4000000040000000;
              auVar25._12_4_ = 0x40000000;
              auVar25._16_4_ = 0x40000000;
              auVar25._20_4_ = 0x40000000;
              auVar25._24_4_ = 0x40000000;
              auVar25._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar111,auVar82,auVar25);
              local_220 = 0;
              local_21c = iVar12;
              local_210 = local_3f0;
              local_200 = local_400;
              local_1f0 = *(undefined8 *)*pauVar3;
              uStack_1e8 = *(undefined8 *)(*pauVar3 + 8);
              if ((pGVar13->mask & local_538->mask) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar71 = true, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a50ef6;
                fVar157 = 1.0 / (float)local_300._0_4_;
                local_1c0[0] = fVar157 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar157 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar157 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar157 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar157 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar157 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar157 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                lVar68 = 0;
                uVar70 = (ulong)((byte)uVar138 & bVar74);
                for (uVar69 = uVar70; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000)
                {
                  lVar68 = lVar68 + 1;
                }
                local_410 = auVar78;
                while (auVar80 = auVar173._0_16_, auVar78 = local_410, uVar70 != 0) {
                  local_2a0._0_8_ = uVar70;
                  local_4c4 = local_1c0[lVar68];
                  local_4c0 = *(undefined4 *)(local_1a0 + lVar68 * 4);
                  local_528 = CONCAT44(local_528._4_4_,local_538->tfar);
                  local_2c0._0_8_ = lVar68;
                  local_538->tfar = *(float *)(local_180 + lVar68 * 4);
                  local_500.context = context->user;
                  fVar157 = 1.0 - local_4c4;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar157 + fVar157))),
                                            ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                  auVar134 = ZEXT416((uint)local_4c4);
                  auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar134,
                                            ZEXT416(0xc0a00000));
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                            ZEXT416((uint)(local_4c4 + local_4c4)),auVar78);
                  auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar134,
                                            ZEXT416(0x40000000));
                  auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                            ZEXT416((uint)(fVar157 + fVar157)),auVar78);
                  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar134,
                                             ZEXT416((uint)(fVar157 * -2.0)));
                  fVar157 = auVar8._0_4_ * 0.5;
                  fVar140 = auVar79._0_4_ * 0.5;
                  fVar137 = auVar78._0_4_ * 0.5;
                  fVar75 = auVar134._0_4_ * 0.5;
                  auVar146._0_4_ = fVar75 * local_3a0;
                  auVar146._4_4_ = fVar75 * fStack_39c;
                  auVar146._8_4_ = fVar75 * fStack_398;
                  auVar146._12_4_ = fVar75 * fStack_394;
                  auVar155._4_4_ = fVar137;
                  auVar155._0_4_ = fVar137;
                  auVar155._8_4_ = fVar137;
                  auVar155._12_4_ = fVar137;
                  auVar64._8_8_ = uStack_508;
                  auVar64._0_8_ = local_510;
                  auVar78 = vfmadd132ps_fma(auVar155,auVar146,auVar64);
                  auVar147._4_4_ = fVar140;
                  auVar147._0_4_ = fVar140;
                  auVar147._8_4_ = fVar140;
                  auVar147._12_4_ = fVar140;
                  auVar78 = vfmadd213ps_fma(auVar147,local_400,auVar78);
                  auVar142._4_4_ = fVar157;
                  auVar142._0_4_ = fVar157;
                  auVar142._8_4_ = fVar157;
                  auVar142._12_4_ = fVar157;
                  auVar78 = vfmadd213ps_fma(auVar142,local_3f0,auVar78);
                  local_4d0 = vmovlps_avx(auVar78);
                  local_4c8 = vextractps_avx(auVar78,2);
                  local_4bc = (int)local_488;
                  local_4b8 = (int)local_530;
                  local_4b4 = (local_500.context)->instID[0];
                  local_4b0 = (local_500.context)->instPrimID[0];
                  local_54c = -1;
                  local_500.valid = &local_54c;
                  local_500.geometryUserPtr = pGVar13->userPtr;
                  local_500.ray = (RTCRayN *)local_538;
                  local_500.hit = (RTCHitN *)&local_4d0;
                  local_500.N = 1;
                  if ((pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar13->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar13->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var14)(&local_500), *local_500.valid != 0)))) {
                      bVar71 = true;
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar180 = ZEXT3264(auVar92);
                      auVar78 = vxorps_avx512vl(auVar80,auVar80);
                      auVar173 = ZEXT1664(auVar78);
                      auVar174 = ZEXT3264(local_340);
                      auVar175 = ZEXT3264(local_360);
                      auVar177 = ZEXT3264(local_380);
                      auVar179 = ZEXT3264(local_3c0);
                      auVar176 = ZEXT3264(local_440);
                      auVar178 = ZEXT3264(local_460);
                      auVar172 = ZEXT3264(local_3e0);
                      auVar181 = ZEXT3264(local_480);
                      auVar78 = local_410;
                      goto LAB_01a50ef6;
                    }
                  }
                  local_538->tfar = (float)local_528;
                  lVar68 = 0;
                  uVar70 = local_2a0._0_8_ ^ 1L << (local_2c0._0_8_ & 0x3f);
                  for (uVar69 = uVar70; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000
                      ) {
                    lVar68 = lVar68 + 1;
                  }
                  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar180 = ZEXT3264(auVar92);
                  auVar78 = vxorps_avx512vl(auVar80,auVar80);
                  auVar173 = ZEXT1664(auVar78);
                  auVar174 = ZEXT3264(local_340);
                  auVar175 = ZEXT3264(local_360);
                  auVar177 = ZEXT3264(local_380);
                  auVar179 = ZEXT3264(local_3c0);
                  auVar176 = ZEXT3264(local_440);
                  auVar178 = ZEXT3264(local_460);
                  auVar172 = ZEXT3264(local_3e0);
                  auVar181 = ZEXT3264(local_480);
                }
              }
            }
          }
          bVar71 = false;
          goto LAB_01a50ef6;
        }
      }
      bVar71 = false;
    }
LAB_01a50ef6:
    if (8 < iVar12) {
      local_2a0 = vpbroadcastd_avx512vl();
      local_2c0 = vbroadcastss_avx512vl(auVar78);
      auVar136._8_4_ = 3;
      auVar136._0_8_ = 0x300000003;
      auVar136._12_4_ = 3;
      auVar136._16_4_ = 3;
      auVar136._20_4_ = 3;
      auVar136._24_4_ = 3;
      auVar136._28_4_ = 3;
      local_2e0 = vpermps_avx2(auVar136,local_2e0);
      local_300._4_4_ = 1.0 / (float)local_300._0_4_;
      local_300._0_4_ = local_300._4_4_;
      fStack_2f8 = (float)local_300._4_4_;
      fStack_2f4 = (float)local_300._4_4_;
      fStack_2f0 = (float)local_300._4_4_;
      fStack_2ec = (float)local_300._4_4_;
      fStack_2e8 = (float)local_300._4_4_;
      fStack_2e4 = (float)local_300._4_4_;
      local_3c0 = auVar179._0_32_;
      local_3e0 = auVar172._0_32_;
      uVar69 = local_530;
      for (lVar68 = 8; lVar68 < local_548; lVar68 = lVar68 + 8) {
        auVar92 = vpbroadcastd_avx512vl();
        auVar93 = vpor_avx2(auVar92,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar93,local_2a0,1);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar68 * 4 + lVar72);
        auVar88 = *(undefined1 (*) [32])(lVar72 + 0x22047f0 + lVar68 * 4);
        auVar89 = *(undefined1 (*) [32])(lVar72 + 0x2204c74 + lVar68 * 4);
        auVar90 = *(undefined1 (*) [32])(lVar72 + 0x22050f8 + lVar68 * 4);
        auVar97 = auVar172._0_32_;
        auVar91 = vmulps_avx512vl(auVar97,auVar90);
        auVar135 = auVar181._0_32_;
        auVar100 = vmulps_avx512vl(auVar135,auVar90);
        auVar46._4_4_ = auVar90._4_4_ * (float)local_100._4_4_;
        auVar46._0_4_ = auVar90._0_4_ * (float)local_100._0_4_;
        auVar46._8_4_ = auVar90._8_4_ * fStack_f8;
        auVar46._12_4_ = auVar90._12_4_ * fStack_f4;
        auVar46._16_4_ = auVar90._16_4_ * fStack_f0;
        auVar46._20_4_ = auVar90._20_4_ * fStack_ec;
        auVar46._24_4_ = auVar90._24_4_ * fStack_e8;
        auVar46._28_4_ = auVar93._28_4_;
        auVar98 = auVar176._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar98);
        auVar168 = auVar178._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar100,auVar89,auVar168);
        auVar100 = vfmadd231ps_avx512vl(auVar46,auVar89,local_e0);
        auVar162 = auVar177._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar162);
        auVar169 = auVar179._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar169);
        auVar78 = vfmadd231ps_fma(auVar100,auVar88,local_c0);
        local_340 = auVar174._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar93,auVar92,local_340);
        local_360 = auVar175._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar91,auVar92,local_360);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar68 * 4 + lVar72);
        auVar91 = *(undefined1 (*) [32])(lVar72 + 0x2206c10 + lVar68 * 4);
        auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar92,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar72 + 0x2207094 + lVar68 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar72 + 0x2207518 + lVar68 * 4);
        auVar94 = vmulps_avx512vl(auVar97,auVar99);
        auVar82 = vmulps_avx512vl(auVar135,auVar99);
        auVar47._4_4_ = auVar99._4_4_ * (float)local_100._4_4_;
        auVar47._0_4_ = auVar99._0_4_ * (float)local_100._0_4_;
        auVar47._8_4_ = auVar99._8_4_ * fStack_f8;
        auVar47._12_4_ = auVar99._12_4_ * fStack_f4;
        auVar47._16_4_ = auVar99._16_4_ * fStack_f0;
        auVar47._20_4_ = auVar99._20_4_ * fStack_ec;
        auVar47._24_4_ = auVar99._24_4_ * fStack_e8;
        auVar47._28_4_ = uStack_e4;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar98);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar100,auVar168);
        auVar83 = vfmadd231ps_avx512vl(auVar47,auVar100,local_e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar162);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar91,auVar169);
        auVar80 = vfmadd231ps_fma(auVar83,auVar91,local_c0);
        auVar83 = vfmadd231ps_avx512vl(auVar94,auVar93,local_340);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,local_360);
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar93,local_a0);
        auVar84 = vmaxps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar80));
        auVar94 = vsubps_avx(auVar83,auVar86);
        auVar85 = vsubps_avx512vl(auVar82,auVar87);
        auVar95 = vmulps_avx512vl(auVar87,auVar94);
        auVar96 = vmulps_avx512vl(auVar86,auVar85);
        auVar95 = vsubps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(auVar85,auVar85);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar94);
        auVar84 = vmulps_avx512vl(auVar84,auVar84);
        auVar84 = vmulps_avx512vl(auVar84,auVar96);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar138 = vcmpps_avx512vl(auVar95,auVar84,2);
        bVar74 = (byte)uVar22 & (byte)uVar138;
        if (bVar74 == 0) {
          auVar176 = ZEXT3264(auVar98);
          auVar172 = ZEXT3264(auVar97);
          auVar181 = ZEXT3264(auVar135);
        }
        else {
          auVar99 = vmulps_avx512vl(local_160,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar100);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_320,auVar91);
          auVar90 = vmulps_avx512vl(local_160,auVar90);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar89);
          auVar91 = vfmadd213ps_avx512vl(auVar92,local_320,auVar88);
          auVar92 = *(undefined1 (*) [32])(lVar72 + 0x220557c + lVar68 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar72 + 0x2205a00 + lVar68 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar72 + 0x2205e84 + lVar68 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar72 + 0x2206308 + lVar68 * 4);
          auVar100 = vmulps_avx512vl(auVar97,auVar90);
          auVar99 = vmulps_avx512vl(auVar135,auVar90);
          auVar90 = vmulps_avx512vl(local_160,auVar90);
          auVar79 = vfmadd231ps_fma(auVar100,auVar89,auVar98);
          auVar100 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar168);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar88,auVar162);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar169);
          auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar88,local_320,auVar92);
          auVar92 = *(undefined1 (*) [32])(lVar72 + 0x220799c + lVar68 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar72 + 0x22082a4 + lVar68 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar72 + 0x2208728 + lVar68 * 4);
          auVar84 = vmulps_avx512vl(auVar97,auVar89);
          auVar95 = vmulps_avx512vl(auVar135,auVar89);
          auVar89 = vmulps_avx512vl(local_160,auVar89);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar98);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,auVar168);
          auVar89 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
          auVar88 = *(undefined1 (*) [32])(lVar72 + 0x2207e20 + lVar68 * 4);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar162);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,auVar169);
          auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar92,local_340);
          auVar84 = vfmadd231ps_avx512vl(auVar95,auVar92,local_360);
          auVar88 = vfmadd231ps_avx512vl(auVar88,local_320,auVar92);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar90,auVar95);
          vandps_avx512vl(auVar100,auVar95);
          auVar92 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(auVar99,auVar95);
          auVar92 = vmaxps_avx(auVar92,auVar95);
          uVar70 = vcmpps_avx512vl(auVar92,local_2c0,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar112._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar90._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar90._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar90._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar90._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar90._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar90._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar90._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar112._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar90._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar113._0_4_ = (float)((uint)bVar15 * auVar85._0_4_ | (uint)!bVar15 * auVar100._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar100._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar100._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar100._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar113._16_4_ = (float)((uint)bVar15 * auVar85._16_4_ | (uint)!bVar15 * auVar100._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar113._20_4_ = (float)((uint)bVar15 * auVar85._20_4_ | (uint)!bVar15 * auVar100._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar113._24_4_ = (float)((uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * auVar100._24_4_)
          ;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar113._28_4_ = (uint)bVar15 * auVar85._28_4_ | (uint)!bVar15 * auVar100._28_4_;
          vandps_avx512vl(auVar89,auVar95);
          vandps_avx512vl(auVar84,auVar95);
          auVar92 = vmaxps_avx(auVar113,auVar113);
          vandps_avx512vl(auVar88,auVar95);
          auVar92 = vmaxps_avx(auVar92,auVar113);
          uVar70 = vcmpps_avx512vl(auVar92,local_2c0,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar114._0_4_ = (uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar89._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar89._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar89._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar89._12_4_;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar114._16_4_ = (uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar89._16_4_;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar114._20_4_ = (uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar89._20_4_;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar114._24_4_ = (uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar89._24_4_;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar114._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar89._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar115._0_4_ = (float)((uint)bVar15 * auVar85._0_4_ | (uint)!bVar15 * auVar84._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar84._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar84._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar84._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar15 * auVar85._16_4_ | (uint)!bVar15 * auVar84._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar15 * auVar85._20_4_ | (uint)!bVar15 * auVar84._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * auVar84._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar115._28_4_ = (uint)bVar15 * auVar85._28_4_ | (uint)!bVar15 * auVar84._28_4_;
          auVar164._8_4_ = 0x80000000;
          auVar164._0_8_ = 0x8000000080000000;
          auVar164._12_4_ = 0x80000000;
          auVar164._16_4_ = 0x80000000;
          auVar164._20_4_ = 0x80000000;
          auVar164._24_4_ = 0x80000000;
          auVar164._28_4_ = 0x80000000;
          auVar92 = vxorps_avx512vl(auVar114,auVar164);
          auVar85 = auVar173._0_32_;
          auVar88 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar85);
          auVar79 = vfmadd231ps_fma(auVar88,auVar113,auVar113);
          auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
          auVar171._8_4_ = 0xbf000000;
          auVar171._0_8_ = 0xbf000000bf000000;
          auVar171._12_4_ = 0xbf000000;
          auVar171._16_4_ = 0xbf000000;
          auVar171._20_4_ = 0xbf000000;
          auVar171._24_4_ = 0xbf000000;
          auVar171._28_4_ = 0xbf000000;
          fVar157 = auVar88._0_4_;
          fVar140 = auVar88._4_4_;
          fVar137 = auVar88._8_4_;
          fVar75 = auVar88._12_4_;
          fVar76 = auVar88._16_4_;
          fVar122 = auVar88._20_4_;
          fVar123 = auVar88._24_4_;
          auVar48._4_4_ = fVar140 * fVar140 * fVar140 * auVar79._4_4_ * -0.5;
          auVar48._0_4_ = fVar157 * fVar157 * fVar157 * auVar79._0_4_ * -0.5;
          auVar48._8_4_ = fVar137 * fVar137 * fVar137 * auVar79._8_4_ * -0.5;
          auVar48._12_4_ = fVar75 * fVar75 * fVar75 * auVar79._12_4_ * -0.5;
          auVar48._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
          auVar48._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar48._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar48._28_4_ = auVar113._28_4_;
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar88 = vfmadd231ps_avx512vl(auVar48,auVar89,auVar88);
          auVar49._4_4_ = auVar113._4_4_ * auVar88._4_4_;
          auVar49._0_4_ = auVar113._0_4_ * auVar88._0_4_;
          auVar49._8_4_ = auVar113._8_4_ * auVar88._8_4_;
          auVar49._12_4_ = auVar113._12_4_ * auVar88._12_4_;
          auVar49._16_4_ = auVar113._16_4_ * auVar88._16_4_;
          auVar49._20_4_ = auVar113._20_4_ * auVar88._20_4_;
          auVar49._24_4_ = auVar113._24_4_ * auVar88._24_4_;
          auVar49._28_4_ = 0;
          auVar50._4_4_ = auVar88._4_4_ * -auVar112._4_4_;
          auVar50._0_4_ = auVar88._0_4_ * -auVar112._0_4_;
          auVar50._8_4_ = auVar88._8_4_ * -auVar112._8_4_;
          auVar50._12_4_ = auVar88._12_4_ * -auVar112._12_4_;
          auVar50._16_4_ = auVar88._16_4_ * -auVar112._16_4_;
          auVar50._20_4_ = auVar88._20_4_ * -auVar112._20_4_;
          auVar50._24_4_ = auVar88._24_4_ * -auVar112._24_4_;
          auVar50._28_4_ = auVar113._28_4_;
          auVar90 = vmulps_avx512vl(auVar88,auVar85);
          auVar88 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar85);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar115,auVar115);
          auVar100 = vrsqrt14ps_avx512vl(auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar171);
          fVar157 = auVar100._0_4_;
          fVar140 = auVar100._4_4_;
          fVar137 = auVar100._8_4_;
          fVar75 = auVar100._12_4_;
          fVar76 = auVar100._16_4_;
          fVar122 = auVar100._20_4_;
          fVar123 = auVar100._24_4_;
          auVar51._4_4_ = fVar140 * fVar140 * fVar140 * auVar88._4_4_;
          auVar51._0_4_ = fVar157 * fVar157 * fVar157 * auVar88._0_4_;
          auVar51._8_4_ = fVar137 * fVar137 * fVar137 * auVar88._8_4_;
          auVar51._12_4_ = fVar75 * fVar75 * fVar75 * auVar88._12_4_;
          auVar51._16_4_ = fVar76 * fVar76 * fVar76 * auVar88._16_4_;
          auVar51._20_4_ = fVar122 * fVar122 * fVar122 * auVar88._20_4_;
          auVar51._24_4_ = fVar123 * fVar123 * fVar123 * auVar88._24_4_;
          auVar51._28_4_ = auVar88._28_4_;
          auVar88 = vfmadd231ps_avx512vl(auVar51,auVar89,auVar100);
          auVar52._4_4_ = auVar115._4_4_ * auVar88._4_4_;
          auVar52._0_4_ = auVar115._0_4_ * auVar88._0_4_;
          auVar52._8_4_ = auVar115._8_4_ * auVar88._8_4_;
          auVar52._12_4_ = auVar115._12_4_ * auVar88._12_4_;
          auVar52._16_4_ = auVar115._16_4_ * auVar88._16_4_;
          auVar52._20_4_ = auVar115._20_4_ * auVar88._20_4_;
          auVar52._24_4_ = auVar115._24_4_ * auVar88._24_4_;
          auVar52._28_4_ = auVar100._28_4_;
          auVar53._4_4_ = auVar88._4_4_ * auVar92._4_4_;
          auVar53._0_4_ = auVar88._0_4_ * auVar92._0_4_;
          auVar53._8_4_ = auVar88._8_4_ * auVar92._8_4_;
          auVar53._12_4_ = auVar88._12_4_ * auVar92._12_4_;
          auVar53._16_4_ = auVar88._16_4_ * auVar92._16_4_;
          auVar53._20_4_ = auVar88._20_4_ * auVar92._20_4_;
          auVar53._24_4_ = auVar88._24_4_ * auVar92._24_4_;
          auVar53._28_4_ = auVar92._28_4_;
          auVar92 = vmulps_avx512vl(auVar88,auVar85);
          auVar79 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar78),auVar86);
          auVar88 = ZEXT1632(auVar78);
          auVar134 = vfmadd213ps_fma(auVar50,auVar88,auVar87);
          auVar89 = vfmadd213ps_avx512vl(auVar90,auVar88,auVar91);
          auVar100 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar80),auVar83);
          auVar11 = vfnmadd213ps_fma(auVar49,auVar88,auVar86);
          auVar99 = ZEXT1632(auVar80);
          auVar8 = vfmadd213ps_fma(auVar53,auVar99,auVar82);
          auVar21 = vfnmadd213ps_fma(auVar50,auVar88,auVar87);
          auVar9 = vfmadd213ps_fma(auVar92,auVar99,auVar93);
          auVar84 = ZEXT1632(auVar78);
          auVar158 = vfnmadd231ps_fma(auVar91,auVar84,auVar90);
          auVar81 = vfnmadd213ps_fma(auVar52,auVar99,auVar83);
          auVar141 = vfnmadd213ps_fma(auVar53,auVar99,auVar82);
          auVar159 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar80),auVar92);
          auVar93 = vsubps_avx512vl(auVar100,ZEXT1632(auVar11));
          auVar92 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar21));
          auVar88 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar158));
          auVar54._4_4_ = auVar92._4_4_ * auVar158._4_4_;
          auVar54._0_4_ = auVar92._0_4_ * auVar158._0_4_;
          auVar54._8_4_ = auVar92._8_4_ * auVar158._8_4_;
          auVar54._12_4_ = auVar92._12_4_ * auVar158._12_4_;
          auVar54._16_4_ = auVar92._16_4_ * 0.0;
          auVar54._20_4_ = auVar92._20_4_ * 0.0;
          auVar54._24_4_ = auVar92._24_4_ * 0.0;
          auVar54._28_4_ = auVar90._28_4_;
          auVar78 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar21),auVar88);
          auVar55._4_4_ = auVar88._4_4_ * auVar11._4_4_;
          auVar55._0_4_ = auVar88._0_4_ * auVar11._0_4_;
          auVar55._8_4_ = auVar88._8_4_ * auVar11._8_4_;
          auVar55._12_4_ = auVar88._12_4_ * auVar11._12_4_;
          auVar55._16_4_ = auVar88._16_4_ * 0.0;
          auVar55._20_4_ = auVar88._20_4_ * 0.0;
          auVar55._24_4_ = auVar88._24_4_ * 0.0;
          auVar55._28_4_ = auVar88._28_4_;
          auVar10 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar158),auVar93);
          auVar56._4_4_ = auVar21._4_4_ * auVar93._4_4_;
          auVar56._0_4_ = auVar21._0_4_ * auVar93._0_4_;
          auVar56._8_4_ = auVar21._8_4_ * auVar93._8_4_;
          auVar56._12_4_ = auVar21._12_4_ * auVar93._12_4_;
          auVar56._16_4_ = auVar93._16_4_ * 0.0;
          auVar56._20_4_ = auVar93._20_4_ * 0.0;
          auVar56._24_4_ = auVar93._24_4_ * 0.0;
          auVar56._28_4_ = auVar93._28_4_;
          auVar77 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar11),auVar92);
          auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar85,ZEXT1632(auVar10));
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar85,ZEXT1632(auVar78));
          uVar70 = vcmpps_avx512vl(auVar92,auVar85,2);
          bVar66 = (byte)uVar70;
          fVar129 = (float)((uint)(bVar66 & 1) * auVar79._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar81._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar124 = (float)((uint)bVar15 * auVar79._4_4_ | (uint)!bVar15 * auVar81._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar127 = (float)((uint)bVar15 * auVar79._8_4_ | (uint)!bVar15 * auVar81._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar131 = (float)((uint)bVar15 * auVar79._12_4_ | (uint)!bVar15 * auVar81._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar127,CONCAT44(fVar124,fVar129))));
          fVar130 = (float)((uint)(bVar66 & 1) * auVar134._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar141._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar125 = (float)((uint)bVar15 * auVar134._4_4_ | (uint)!bVar15 * auVar141._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar128 = (float)((uint)bVar15 * auVar134._8_4_ | (uint)!bVar15 * auVar141._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar132 = (float)((uint)bVar15 * auVar134._12_4_ | (uint)!bVar15 * auVar141._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar125,fVar130))));
          auVar116._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar159._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar15 * auVar89._4_4_ | (uint)!bVar15 * auVar159._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar15 * auVar89._8_4_ | (uint)!bVar15 * auVar159._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar15 * auVar89._12_4_ | (uint)!bVar15 * auVar159._12_4_)
          ;
          fVar137 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar89._16_4_);
          auVar116._16_4_ = fVar137;
          fVar140 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar89._20_4_);
          auVar116._20_4_ = fVar140;
          fVar157 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar89._24_4_);
          auVar116._24_4_ = fVar157;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar89._28_4_;
          auVar116._28_4_ = iVar1;
          auVar92 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar100);
          auVar117._0_4_ =
               (uint)(bVar66 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar78._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar78._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar78._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar78._12_4_;
          auVar117._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_;
          auVar117._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_;
          auVar117._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_;
          auVar117._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
          auVar92 = vblendmps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar8));
          auVar118._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar79._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar79._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar79._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar79._12_4_);
          fVar122 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
          auVar118._16_4_ = fVar122;
          fVar76 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
          auVar118._20_4_ = fVar76;
          fVar75 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
          auVar118._24_4_ = fVar75;
          auVar118._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
          auVar92 = vblendmps_avx512vl(ZEXT1632(auVar158),ZEXT1632(auVar9));
          auVar119._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar134._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar134._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar134._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar134._12_4_)
          ;
          fVar145 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
          auVar119._16_4_ = fVar145;
          fVar123 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
          auVar119._20_4_ = fVar123;
          fVar126 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
          auVar119._24_4_ = fVar126;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
          auVar119._28_4_ = iVar2;
          auVar120._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar15 * (int)auVar11._4_4_ | (uint)!bVar15 * auVar100._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar15 * (int)auVar11._8_4_ | (uint)!bVar15 * auVar100._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar15 * (int)auVar11._12_4_ | (uint)!bVar15 * auVar100._12_4_;
          auVar120._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar100._16_4_;
          auVar120._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar100._20_4_;
          auVar120._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar100._24_4_;
          auVar120._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar100._28_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar120,auVar99);
          auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar21._12_4_ |
                                                  (uint)!bVar19 * auVar8._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar21._8_4_ |
                                                           (uint)!bVar18 * auVar8._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar21._4_4_ |
                                                                    (uint)!bVar15 * auVar8._4_4_,
                                                                    (uint)(bVar66 & 1) *
                                                                    (int)auVar21._0_4_ |
                                                                    (uint)!(bool)(bVar66 & 1) *
                                                                    auVar8._0_4_)))),auVar94);
          auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar158._12_4_ |
                                                  (uint)!bVar20 * auVar9._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar158._8_4_ |
                                                           (uint)!bVar17 * auVar9._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar158._4_4_ |
                                                                    (uint)!bVar16 * auVar9._4_4_,
                                                                    (uint)(bVar66 & 1) *
                                                                    (int)auVar158._0_4_ |
                                                                    (uint)!(bool)(bVar66 & 1) *
                                                                    auVar9._0_4_)))),auVar116);
          auVar90 = vsubps_avx(auVar99,auVar117);
          auVar93 = vsubps_avx(auVar94,auVar118);
          auVar91 = vsubps_avx(auVar116,auVar119);
          auVar57._4_4_ = auVar89._4_4_ * fVar124;
          auVar57._0_4_ = auVar89._0_4_ * fVar129;
          auVar57._8_4_ = auVar89._8_4_ * fVar127;
          auVar57._12_4_ = auVar89._12_4_ * fVar131;
          auVar57._16_4_ = auVar89._16_4_ * 0.0;
          auVar57._20_4_ = auVar89._20_4_ * 0.0;
          auVar57._24_4_ = auVar89._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar57,auVar116,auVar100);
          auVar151._0_4_ = fVar130 * auVar100._0_4_;
          auVar151._4_4_ = fVar125 * auVar100._4_4_;
          auVar151._8_4_ = fVar128 * auVar100._8_4_;
          auVar151._12_4_ = fVar132 * auVar100._12_4_;
          auVar151._16_4_ = auVar100._16_4_ * 0.0;
          auVar151._20_4_ = auVar100._20_4_ * 0.0;
          auVar151._24_4_ = auVar100._24_4_ * 0.0;
          auVar151._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar151,auVar99,auVar88);
          auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar85,ZEXT1632(auVar78));
          auVar153._0_4_ = auVar88._0_4_ * auVar116._0_4_;
          auVar153._4_4_ = auVar88._4_4_ * auVar116._4_4_;
          auVar153._8_4_ = auVar88._8_4_ * auVar116._8_4_;
          auVar153._12_4_ = auVar88._12_4_ * auVar116._12_4_;
          auVar153._16_4_ = auVar88._16_4_ * fVar137;
          auVar153._20_4_ = auVar88._20_4_ * fVar140;
          auVar153._24_4_ = auVar88._24_4_ * fVar157;
          auVar153._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar153,auVar94,auVar89);
          auVar86 = vfmadd231ps_avx512vl(auVar92,auVar85,ZEXT1632(auVar78));
          auVar92 = vmulps_avx512vl(auVar91,auVar117);
          auVar92 = vfmsub231ps_avx512vl(auVar92,auVar90,auVar119);
          auVar58._4_4_ = auVar93._4_4_ * auVar119._4_4_;
          auVar58._0_4_ = auVar93._0_4_ * auVar119._0_4_;
          auVar58._8_4_ = auVar93._8_4_ * auVar119._8_4_;
          auVar58._12_4_ = auVar93._12_4_ * auVar119._12_4_;
          auVar58._16_4_ = auVar93._16_4_ * fVar145;
          auVar58._20_4_ = auVar93._20_4_ * fVar123;
          auVar58._24_4_ = auVar93._24_4_ * fVar126;
          auVar58._28_4_ = iVar2;
          auVar78 = vfmsub231ps_fma(auVar58,auVar118,auVar91);
          auVar154._0_4_ = auVar118._0_4_ * auVar90._0_4_;
          auVar154._4_4_ = auVar118._4_4_ * auVar90._4_4_;
          auVar154._8_4_ = auVar118._8_4_ * auVar90._8_4_;
          auVar154._12_4_ = auVar118._12_4_ * auVar90._12_4_;
          auVar154._16_4_ = fVar122 * auVar90._16_4_;
          auVar154._20_4_ = fVar76 * auVar90._20_4_;
          auVar154._24_4_ = fVar75 * auVar90._24_4_;
          auVar154._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar154,auVar93,auVar117);
          auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar85,auVar92);
          auVar87 = vfmadd231ps_avx512vl(auVar92,auVar85,ZEXT1632(auVar78));
          auVar92 = vmaxps_avx(auVar86,auVar87);
          uVar138 = vcmpps_avx512vl(auVar92,auVar85,2);
          bVar74 = bVar74 & (byte)uVar138;
          if (bVar74 != 0) {
            auVar59._4_4_ = auVar91._4_4_ * auVar88._4_4_;
            auVar59._0_4_ = auVar91._0_4_ * auVar88._0_4_;
            auVar59._8_4_ = auVar91._8_4_ * auVar88._8_4_;
            auVar59._12_4_ = auVar91._12_4_ * auVar88._12_4_;
            auVar59._16_4_ = auVar91._16_4_ * auVar88._16_4_;
            auVar59._20_4_ = auVar91._20_4_ * auVar88._20_4_;
            auVar59._24_4_ = auVar91._24_4_ * auVar88._24_4_;
            auVar59._28_4_ = auVar92._28_4_;
            auVar134 = vfmsub231ps_fma(auVar59,auVar93,auVar89);
            auVar60._4_4_ = auVar89._4_4_ * auVar90._4_4_;
            auVar60._0_4_ = auVar89._0_4_ * auVar90._0_4_;
            auVar60._8_4_ = auVar89._8_4_ * auVar90._8_4_;
            auVar60._12_4_ = auVar89._12_4_ * auVar90._12_4_;
            auVar60._16_4_ = auVar89._16_4_ * auVar90._16_4_;
            auVar60._20_4_ = auVar89._20_4_ * auVar90._20_4_;
            auVar60._24_4_ = auVar89._24_4_ * auVar90._24_4_;
            auVar60._28_4_ = auVar89._28_4_;
            auVar79 = vfmsub231ps_fma(auVar60,auVar100,auVar91);
            auVar61._4_4_ = auVar93._4_4_ * auVar100._4_4_;
            auVar61._0_4_ = auVar93._0_4_ * auVar100._0_4_;
            auVar61._8_4_ = auVar93._8_4_ * auVar100._8_4_;
            auVar61._12_4_ = auVar93._12_4_ * auVar100._12_4_;
            auVar61._16_4_ = auVar93._16_4_ * auVar100._16_4_;
            auVar61._20_4_ = auVar93._20_4_ * auVar100._20_4_;
            auVar61._24_4_ = auVar93._24_4_ * auVar100._24_4_;
            auVar61._28_4_ = auVar93._28_4_;
            auVar8 = vfmsub231ps_fma(auVar61,auVar90,auVar88);
            auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar8));
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar134),auVar85);
            auVar88 = vrcp14ps_avx512vl(auVar92);
            auVar90 = auVar180._0_32_;
            auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar92,auVar90);
            auVar78 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
            auVar62._4_4_ = auVar8._4_4_ * auVar116._4_4_;
            auVar62._0_4_ = auVar8._0_4_ * auVar116._0_4_;
            auVar62._8_4_ = auVar8._8_4_ * auVar116._8_4_;
            auVar62._12_4_ = auVar8._12_4_ * auVar116._12_4_;
            auVar62._16_4_ = fVar137 * 0.0;
            auVar62._20_4_ = fVar140 * 0.0;
            auVar62._24_4_ = fVar157 * 0.0;
            auVar62._28_4_ = iVar1;
            auVar79 = vfmadd231ps_fma(auVar62,auVar94,ZEXT1632(auVar79));
            auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,ZEXT1632(auVar134));
            fVar140 = auVar78._0_4_;
            fVar137 = auVar78._4_4_;
            fVar75 = auVar78._8_4_;
            fVar76 = auVar78._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar76,
                                           CONCAT48(auVar79._8_4_ * fVar75,
                                                    CONCAT44(auVar79._4_4_ * fVar137,
                                                             auVar79._0_4_ * fVar140))));
            uVar138 = vcmpps_avx512vl(local_240,local_2e0,0xd);
            fVar157 = local_538->tfar;
            auVar27._4_4_ = fVar157;
            auVar27._0_4_ = fVar157;
            auVar27._8_4_ = fVar157;
            auVar27._12_4_ = fVar157;
            auVar27._16_4_ = fVar157;
            auVar27._20_4_ = fVar157;
            auVar27._24_4_ = fVar157;
            auVar27._28_4_ = fVar157;
            uVar22 = vcmpps_avx512vl(local_240,auVar27,2);
            bVar74 = (byte)uVar138 & (byte)uVar22 & bVar74;
            if (bVar74 != 0) {
              uVar138 = vcmpps_avx512vl(auVar92,auVar85,4);
              bVar74 = bVar74 & (byte)uVar138;
              auVar179 = ZEXT3264(local_3c0);
              auVar176 = ZEXT3264(local_440);
              auVar178 = ZEXT3264(local_460);
              auVar172 = ZEXT3264(local_3e0);
              auVar181 = ZEXT3264(local_480);
              if (bVar74 != 0) {
                fVar157 = auVar86._0_4_ * fVar140;
                fVar122 = auVar86._4_4_ * fVar137;
                auVar63._4_4_ = fVar122;
                auVar63._0_4_ = fVar157;
                fVar123 = auVar86._8_4_ * fVar75;
                auVar63._8_4_ = fVar123;
                fVar126 = auVar86._12_4_ * fVar76;
                auVar63._12_4_ = fVar126;
                fVar145 = auVar86._16_4_ * 0.0;
                auVar63._16_4_ = fVar145;
                fVar129 = auVar86._20_4_ * 0.0;
                auVar63._20_4_ = fVar129;
                fVar130 = auVar86._24_4_ * 0.0;
                auVar63._24_4_ = fVar130;
                auVar63._28_4_ = auVar92._28_4_;
                auVar88 = vsubps_avx512vl(auVar90,auVar63);
                local_280._0_4_ =
                     (float)((uint)(bVar66 & 1) * (int)fVar157 |
                            (uint)!(bool)(bVar66 & 1) * auVar88._0_4_);
                bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar15 * (int)fVar122 | (uint)!bVar15 * auVar88._4_4_);
                bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar15 * (int)fVar123 | (uint)!bVar15 * auVar88._8_4_);
                bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar15 * (int)fVar126 | (uint)!bVar15 * auVar88._12_4_);
                bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar15 * (int)fVar145 | (uint)!bVar15 * auVar88._16_4_);
                bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar15 * (int)fVar129 | (uint)!bVar15 * auVar88._20_4_);
                bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar15 * (int)fVar130 | (uint)!bVar15 * auVar88._24_4_);
                bVar15 = SUB81(uVar70 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar15 * auVar92._28_4_ | (uint)!bVar15 * auVar88._28_4_);
                auVar92 = vsubps_avx(ZEXT1632(auVar80),auVar84);
                auVar78 = vfmadd213ps_fma(auVar92,local_280,auVar84);
                fVar157 = local_520->depth_scale;
                auVar28._4_4_ = fVar157;
                auVar28._0_4_ = fVar157;
                auVar28._8_4_ = fVar157;
                auVar28._12_4_ = fVar157;
                auVar28._16_4_ = fVar157;
                auVar28._20_4_ = fVar157;
                auVar28._24_4_ = fVar157;
                auVar28._28_4_ = fVar157;
                auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                             CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                                      CONCAT44(auVar78._4_4_ +
                                                                               auVar78._4_4_,
                                                                               auVar78._0_4_ +
                                                                               auVar78._0_4_)))),
                                          auVar28);
                uVar138 = vcmpps_avx512vl(local_240,auVar92,6);
                if (((byte)uVar138 & bVar74) != 0) {
                  auVar139._0_4_ = auVar87._0_4_ * fVar140;
                  auVar139._4_4_ = auVar87._4_4_ * fVar137;
                  auVar139._8_4_ = auVar87._8_4_ * fVar75;
                  auVar139._12_4_ = auVar87._12_4_ * fVar76;
                  auVar139._16_4_ = auVar87._16_4_ * 0.0;
                  auVar139._20_4_ = auVar87._20_4_ * 0.0;
                  auVar139._24_4_ = auVar87._24_4_ * 0.0;
                  auVar139._28_4_ = 0;
                  auVar92 = vsubps_avx512vl(auVar90,auVar139);
                  auVar121._0_4_ =
                       (uint)(bVar66 & 1) * (int)auVar139._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar92._0_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar121._4_4_ =
                       (uint)bVar15 * (int)auVar139._4_4_ | (uint)!bVar15 * auVar92._4_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar121._8_4_ =
                       (uint)bVar15 * (int)auVar139._8_4_ | (uint)!bVar15 * auVar92._8_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar121._12_4_ =
                       (uint)bVar15 * (int)auVar139._12_4_ | (uint)!bVar15 * auVar92._12_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar121._16_4_ =
                       (uint)bVar15 * (int)auVar139._16_4_ | (uint)!bVar15 * auVar92._16_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar121._20_4_ =
                       (uint)bVar15 * (int)auVar139._20_4_ | (uint)!bVar15 * auVar92._20_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar121._24_4_ =
                       (uint)bVar15 * (int)auVar139._24_4_ | (uint)!bVar15 * auVar92._24_4_;
                  auVar121._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar92._28_4_;
                  auVar29._8_4_ = 0x40000000;
                  auVar29._0_8_ = 0x4000000040000000;
                  auVar29._12_4_ = 0x40000000;
                  auVar29._16_4_ = 0x40000000;
                  auVar29._20_4_ = 0x40000000;
                  auVar29._24_4_ = 0x40000000;
                  auVar29._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar121,auVar90,auVar29);
                  local_220 = (int)lVar68;
                  local_21c = iVar12;
                  local_210 = local_3f0;
                  local_200 = local_400;
                  local_1f0 = local_510;
                  uStack_1e8 = uStack_508;
                  pGVar13 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar13->mask & local_538->mask) == 0) {
                    bVar66 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar66 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_490 = pGVar13;
                    auVar78 = vcvtsi2ss_avx512f(auVar173._0_16_,(int)lVar68);
                    fVar157 = auVar78._0_4_;
                    local_1c0[0] = (fVar157 + local_280._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_1c0[1] = (fVar157 + local_280._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_1c0[2] = (fVar157 + local_280._8_4_ + 2.0) * fStack_2f8;
                    local_1c0[3] = (fVar157 + local_280._12_4_ + 3.0) * fStack_2f4;
                    fStack_1b0 = (fVar157 + local_280._16_4_ + 4.0) * fStack_2f0;
                    fStack_1ac = (fVar157 + local_280._20_4_ + 5.0) * fStack_2ec;
                    fStack_1a8 = (fVar157 + local_280._24_4_ + 6.0) * fStack_2e8;
                    fStack_1a4 = fVar157 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    lVar67 = 0;
                    local_528 = (ulong)((byte)uVar138 & bVar74);
                    for (uVar69 = local_528; (uVar69 & 1) == 0;
                        uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                      lVar67 = lVar67 + 1;
                    }
                    local_498 = context;
                    while (local_528 != 0) {
                      local_4c4 = local_1c0[lVar67];
                      local_4c0 = *(undefined4 *)(local_1a0 + lVar67 * 4);
                      local_514 = local_538->tfar;
                      local_410._0_8_ = lVar67;
                      local_538->tfar = *(float *)(local_180 + lVar67 * 4);
                      local_500.context = local_498->user;
                      fVar157 = 1.0 - local_4c4;
                      auVar134 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar157 + fVar157))),
                                                  ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                      auVar79 = ZEXT416((uint)local_4c4);
                      auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                ZEXT416(0xc0a00000));
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                                ZEXT416((uint)(local_4c4 + local_4c4)),auVar78);
                      auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                ZEXT416(0x40000000));
                      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                                ZEXT416((uint)(fVar157 + fVar157)),auVar78);
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar79,
                                                ZEXT416((uint)(fVar157 * -2.0)));
                      fVar157 = auVar134._0_4_ * 0.5;
                      fVar140 = auVar80._0_4_ * 0.5;
                      fVar137 = auVar78._0_4_ * 0.5;
                      fVar75 = auVar79._0_4_ * 0.5;
                      auVar148._0_4_ = fVar75 * local_3a0;
                      auVar148._4_4_ = fVar75 * fStack_39c;
                      auVar148._8_4_ = fVar75 * fStack_398;
                      auVar148._12_4_ = fVar75 * fStack_394;
                      auVar156._4_4_ = fVar137;
                      auVar156._0_4_ = fVar137;
                      auVar156._8_4_ = fVar137;
                      auVar156._12_4_ = fVar137;
                      auVar65._8_8_ = uStack_508;
                      auVar65._0_8_ = local_510;
                      auVar78 = vfmadd132ps_fma(auVar156,auVar148,auVar65);
                      auVar149._4_4_ = fVar140;
                      auVar149._0_4_ = fVar140;
                      auVar149._8_4_ = fVar140;
                      auVar149._12_4_ = fVar140;
                      auVar78 = vfmadd213ps_fma(auVar149,local_400,auVar78);
                      auVar143._4_4_ = fVar157;
                      auVar143._0_4_ = fVar157;
                      auVar143._8_4_ = fVar157;
                      auVar143._12_4_ = fVar157;
                      auVar78 = vfmadd213ps_fma(auVar143,local_3f0,auVar78);
                      local_4d0 = vmovlps_avx(auVar78);
                      local_4c8 = vextractps_avx(auVar78,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_530;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_54c = -1;
                      local_500.valid = &local_54c;
                      local_500.geometryUserPtr = local_490->userPtr;
                      local_500.ray = (RTCRayN *)local_538;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((local_490->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_490->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        auVar78 = auVar173._0_16_;
                        p_Var14 = local_498->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((local_498->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_490->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var14)(&local_500);
                          auVar78 = auVar173._0_16_;
                          if (*local_500.valid == 0) goto LAB_01a518d1;
                        }
                        bVar66 = 1;
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar78 = vxorps_avx512vl(auVar78,auVar78);
                        goto LAB_01a5199e;
                      }
LAB_01a518d1:
                      local_538->tfar = local_514;
                      lVar67 = 0;
                      local_528 = local_528 ^ 1L << (local_410._0_8_ & 0x3f);
                      for (uVar69 = local_528; (uVar69 & 1) == 0;
                          uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                        lVar67 = lVar67 + 1;
                      }
                    }
                    bVar66 = 0;
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar78 = vxorps_avx512vl(auVar173._0_16_,auVar173._0_16_);
LAB_01a5199e:
                    auVar180 = ZEXT3264(auVar92);
                    auVar173 = ZEXT1664(auVar78);
                    auVar174 = ZEXT3264(local_340);
                    auVar175 = ZEXT3264(local_360);
                    auVar177 = ZEXT3264(local_380);
                    auVar179 = ZEXT3264(local_3c0);
                    auVar176 = ZEXT3264(local_440);
                    auVar178 = ZEXT3264(local_460);
                    auVar172 = ZEXT3264(local_3e0);
                    auVar181 = ZEXT3264(local_480);
                    context = local_498;
                    uVar69 = local_530;
                  }
                  bVar71 = (bool)(bVar71 | bVar66);
                }
              }
              goto LAB_01a51915;
            }
          }
          auVar179 = ZEXT3264(local_3c0);
          auVar176 = ZEXT3264(local_440);
          auVar178 = ZEXT3264(local_460);
          auVar172 = ZEXT3264(local_3e0);
          auVar181 = ZEXT3264(local_480);
        }
LAB_01a51915:
      }
    }
    if (bVar71) break;
    fVar157 = local_538->tfar;
    auVar26._4_4_ = fVar157;
    auVar26._0_4_ = fVar157;
    auVar26._8_4_ = fVar157;
    auVar26._12_4_ = fVar157;
    auVar26._16_4_ = fVar157;
    auVar26._20_4_ = fVar157;
    auVar26._24_4_ = fVar157;
    auVar26._28_4_ = fVar157;
    uVar138 = vcmpps_avx512vl(local_80,auVar26,2);
    local_388 = (ulong)((uint)uVar73 & (uint)uVar138);
  }
  return local_388 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }